

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

void embree::avx512::CurveNiIntersectorK<4,4>::
     intersect_n<embree::avx512::OrientedCurve1IntersectorK<embree::CatmullRomCurveT,4>,embree::avx512::Intersect1KEpilog1<4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  BBox1f BVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  Geometry *pGVar7;
  RTCFilterFunctionN p_Var8;
  void *pvVar9;
  __int_type_conflict _Var10;
  undefined1 auVar11 [16];
  undefined8 uVar12;
  undefined8 uVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  bool bVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  byte bVar24;
  uint uVar25;
  ulong uVar26;
  long lVar27;
  uint uVar28;
  ulong uVar29;
  undefined8 unaff_RBP;
  ulong uVar30;
  ulong uVar31;
  bool bVar32;
  bool bVar33;
  bool bVar34;
  bool bVar35;
  bool bVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar112 [32];
  undefined1 auVar114 [32];
  undefined1 auVar116 [32];
  undefined1 auVar118 [32];
  float fVar120;
  float fVar125;
  vint4 bi_2;
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined4 uVar126;
  vint4 bi_1;
  undefined1 auVar127 [16];
  float fVar132;
  float fVar133;
  undefined1 auVar128 [16];
  float fVar134;
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [32];
  vint4 ai_2;
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  float fVar142;
  float fVar145;
  float fVar146;
  vint4 bi;
  float fVar147;
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  vint4 ai;
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  vint4 ai_1;
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  vfloat4 a0_2;
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [32];
  float fVar193;
  float fVar202;
  float fVar203;
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  float fVar204;
  float fVar205;
  float fVar214;
  float fVar215;
  float fVar216;
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  float fVar217;
  float fVar225;
  float fVar226;
  vfloat4 a0;
  undefined1 auVar218 [16];
  float fVar227;
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  vfloat4 a0_1;
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [64];
  undefined1 auVar238 [64];
  undefined1 auVar239 [64];
  undefined1 auVar240 [64];
  undefined1 auVar241 [64];
  undefined1 auVar242 [64];
  undefined1 in_ZMM29 [64];
  undefined1 auVar243 [64];
  undefined1 auVar244 [64];
  undefined1 auVar245 [64];
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  vfloat_impl<4> p00;
  undefined1 local_368 [16];
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  undefined8 local_308;
  undefined8 uStack_300;
  float local_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float local_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float local_288;
  float fStack_284;
  float fStack_280;
  float fStack_27c;
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  RTCHitN local_128 [16];
  undefined1 local_118 [16];
  undefined4 local_108;
  undefined4 uStack_104;
  undefined4 uStack_100;
  undefined4 uStack_fc;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  undefined1 local_e8 [16];
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined1 local_c8 [16];
  uint local_b8;
  uint uStack_b4;
  uint uStack_b0;
  uint uStack_ac;
  uint uStack_a8;
  uint uStack_a4;
  uint uStack_a0;
  uint uStack_9c;
  undefined4 local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  undefined4 uStack_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  undefined1 local_78 [32];
  BBox1f cv_stack [4];
  undefined1 auVar111 [32];
  undefined1 auVar113 [32];
  undefined1 auVar115 [32];
  undefined1 auVar117 [32];
  undefined1 auVar119 [32];
  
  uVar26 = (ulong)(byte)prim[1];
  fVar120 = *(float *)(prim + uVar26 * 0x19 + 0x12);
  auVar40 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar40 = vinsertps_avx(auVar40,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar41 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar41 = vinsertps_avx(auVar41,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar40 = vsubps_avx(auVar40,*(undefined1 (*) [16])(prim + uVar26 * 0x19 + 6));
  auVar135._0_4_ = fVar120 * auVar40._0_4_;
  auVar135._4_4_ = fVar120 * auVar40._4_4_;
  auVar135._8_4_ = fVar120 * auVar40._8_4_;
  auVar135._12_4_ = fVar120 * auVar40._12_4_;
  auVar45._0_4_ = fVar120 * auVar41._0_4_;
  auVar45._4_4_ = fVar120 * auVar41._4_4_;
  auVar45._8_4_ = fVar120 * auVar41._8_4_;
  auVar45._12_4_ = fVar120 * auVar41._12_4_;
  auVar40 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar26 * 4 + 6)));
  auVar40 = vcvtdq2ps_avx(auVar40);
  auVar41 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar26 * 5 + 6)));
  auVar37 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar26 * 6 + 6)));
  auVar41 = vcvtdq2ps_avx(auVar41);
  auVar37 = vcvtdq2ps_avx(auVar37);
  auVar43 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar26 * 0xb + 6)));
  auVar43 = vcvtdq2ps_avx(auVar43);
  auVar11 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar26 * 0xc + 6)));
  auVar38 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar26 * 0xd + 6)));
  auVar11 = vcvtdq2ps_avx(auVar11);
  auVar38 = vcvtdq2ps_avx(auVar38);
  auVar53 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar26 * 0x12 + 6)));
  auVar53 = vcvtdq2ps_avx(auVar53);
  auVar52 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar26 * 0x13 + 6)));
  auVar39 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar26 * 0x14 + 6)));
  auVar52 = vcvtdq2ps_avx(auVar52);
  auVar39 = vcvtdq2ps_avx(auVar39);
  auVar60._4_4_ = auVar45._0_4_;
  auVar60._0_4_ = auVar45._0_4_;
  auVar60._8_4_ = auVar45._0_4_;
  auVar60._12_4_ = auVar45._0_4_;
  auVar51 = vshufps_avx(auVar45,auVar45,0x55);
  auVar42 = vshufps_avx(auVar45,auVar45,0xaa);
  fVar120 = auVar42._0_4_;
  auVar55._0_4_ = fVar120 * auVar37._0_4_;
  fVar125 = auVar42._4_4_;
  auVar55._4_4_ = fVar125 * auVar37._4_4_;
  fVar204 = auVar42._8_4_;
  auVar55._8_4_ = fVar204 * auVar37._8_4_;
  fVar193 = auVar42._12_4_;
  auVar55._12_4_ = fVar193 * auVar37._12_4_;
  auVar49._0_4_ = auVar38._0_4_ * fVar120;
  auVar49._4_4_ = auVar38._4_4_ * fVar125;
  auVar49._8_4_ = auVar38._8_4_ * fVar204;
  auVar49._12_4_ = auVar38._12_4_ * fVar193;
  auVar47._0_4_ = auVar39._0_4_ * fVar120;
  auVar47._4_4_ = auVar39._4_4_ * fVar125;
  auVar47._8_4_ = auVar39._8_4_ * fVar204;
  auVar47._12_4_ = auVar39._12_4_ * fVar193;
  auVar42 = vfmadd231ps_fma(auVar55,auVar51,auVar41);
  auVar46 = vfmadd231ps_fma(auVar49,auVar51,auVar11);
  auVar51 = vfmadd231ps_fma(auVar47,auVar52,auVar51);
  auVar44 = vfmadd231ps_fma(auVar42,auVar60,auVar40);
  auVar46 = vfmadd231ps_fma(auVar46,auVar60,auVar43);
  auVar45 = vfmadd231ps_fma(auVar51,auVar53,auVar60);
  auVar61._4_4_ = auVar135._0_4_;
  auVar61._0_4_ = auVar135._0_4_;
  auVar61._8_4_ = auVar135._0_4_;
  auVar61._12_4_ = auVar135._0_4_;
  auVar51 = vshufps_avx(auVar135,auVar135,0x55);
  auVar42 = vshufps_avx(auVar135,auVar135,0xaa);
  auVar37 = vmulps_avx512vl(auVar42,auVar37);
  auVar136._0_4_ = auVar42._0_4_ * auVar38._0_4_;
  auVar136._4_4_ = auVar42._4_4_ * auVar38._4_4_;
  auVar136._8_4_ = auVar42._8_4_ * auVar38._8_4_;
  auVar136._12_4_ = auVar42._12_4_ * auVar38._12_4_;
  auVar128._0_4_ = auVar42._0_4_ * auVar39._0_4_;
  auVar128._4_4_ = auVar42._4_4_ * auVar39._4_4_;
  auVar128._8_4_ = auVar42._8_4_ * auVar39._8_4_;
  auVar128._12_4_ = auVar42._12_4_ * auVar39._12_4_;
  auVar38 = vfmadd231ps_avx512vl(auVar37,auVar51,auVar41);
  auVar41 = vfmadd231ps_fma(auVar136,auVar51,auVar11);
  auVar37 = vfmadd231ps_fma(auVar128,auVar51,auVar52);
  auVar39 = vfmadd231ps_avx512vl(auVar38,auVar61,auVar40);
  auVar11 = vfmadd231ps_fma(auVar41,auVar61,auVar43);
  auVar52 = vfmadd231ps_fma(auVar37,auVar61,auVar53);
  auVar40 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar241 = ZEXT1664(auVar40);
  auVar57._8_4_ = 0x219392ef;
  auVar57._0_8_ = 0x219392ef219392ef;
  auVar57._12_4_ = 0x219392ef;
  auVar41 = vandps_avx512vl(auVar44,auVar40);
  uVar30 = vcmpps_avx512vl(auVar41,auVar57,1);
  bVar34 = (bool)((byte)uVar30 & 1);
  auVar42._0_4_ = (uint)bVar34 * 0x219392ef | (uint)!bVar34 * auVar44._0_4_;
  bVar34 = (bool)((byte)(uVar30 >> 1) & 1);
  auVar42._4_4_ = (uint)bVar34 * 0x219392ef | (uint)!bVar34 * auVar44._4_4_;
  bVar34 = (bool)((byte)(uVar30 >> 2) & 1);
  auVar42._8_4_ = (uint)bVar34 * 0x219392ef | (uint)!bVar34 * auVar44._8_4_;
  bVar34 = (bool)((byte)(uVar30 >> 3) & 1);
  auVar42._12_4_ = (uint)bVar34 * 0x219392ef | (uint)!bVar34 * auVar44._12_4_;
  auVar41 = vandps_avx512vl(auVar46,auVar40);
  uVar30 = vcmpps_avx512vl(auVar41,auVar57,1);
  bVar34 = (bool)((byte)uVar30 & 1);
  auVar44._0_4_ = (uint)bVar34 * 0x219392ef | (uint)!bVar34 * auVar46._0_4_;
  bVar34 = (bool)((byte)(uVar30 >> 1) & 1);
  auVar44._4_4_ = (uint)bVar34 * 0x219392ef | (uint)!bVar34 * auVar46._4_4_;
  bVar34 = (bool)((byte)(uVar30 >> 2) & 1);
  auVar44._8_4_ = (uint)bVar34 * 0x219392ef | (uint)!bVar34 * auVar46._8_4_;
  bVar34 = (bool)((byte)(uVar30 >> 3) & 1);
  auVar44._12_4_ = (uint)bVar34 * 0x219392ef | (uint)!bVar34 * auVar46._12_4_;
  auVar40 = vandps_avx512vl(auVar45,auVar40);
  uVar30 = vcmpps_avx512vl(auVar40,auVar57,1);
  bVar34 = (bool)((byte)uVar30 & 1);
  auVar46._0_4_ = (uint)bVar34 * 0x219392ef | (uint)!bVar34 * auVar45._0_4_;
  bVar34 = (bool)((byte)(uVar30 >> 1) & 1);
  auVar46._4_4_ = (uint)bVar34 * 0x219392ef | (uint)!bVar34 * auVar45._4_4_;
  bVar34 = (bool)((byte)(uVar30 >> 2) & 1);
  auVar46._8_4_ = (uint)bVar34 * 0x219392ef | (uint)!bVar34 * auVar45._8_4_;
  bVar34 = (bool)((byte)(uVar30 >> 3) & 1);
  auVar46._12_4_ = (uint)bVar34 * 0x219392ef | (uint)!bVar34 * auVar45._12_4_;
  auVar40 = vrcp14ps_avx512vl(auVar42);
  auVar41 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar242 = ZEXT1664(auVar41);
  auVar37 = vfnmadd213ps_avx512vl(auVar42,auVar40,auVar41);
  auVar37 = vfmadd132ps_fma(auVar37,auVar40,auVar40);
  auVar40 = vrcp14ps_avx512vl(auVar44);
  auVar43 = vfnmadd213ps_avx512vl(auVar44,auVar40,auVar41);
  auVar38 = vfmadd132ps_fma(auVar43,auVar40,auVar40);
  auVar40 = vrcp14ps_avx512vl(auVar46);
  auVar41 = vfnmadd213ps_avx512vl(auVar46,auVar40,auVar41);
  auVar53 = vfmadd132ps_fma(auVar41,auVar40,auVar40);
  auVar40._8_8_ = 0;
  auVar40._0_8_ = *(ulong *)(prim + uVar26 * 7 + 6);
  auVar40 = vpmovsxwd_avx(auVar40);
  auVar40 = vcvtdq2ps_avx(auVar40);
  auVar40 = vsubps_avx512vl(auVar40,auVar39);
  auVar58._0_4_ = auVar37._0_4_ * auVar40._0_4_;
  auVar58._4_4_ = auVar37._4_4_ * auVar40._4_4_;
  auVar58._8_4_ = auVar37._8_4_ * auVar40._8_4_;
  auVar58._12_4_ = auVar37._12_4_ * auVar40._12_4_;
  auVar41._8_8_ = 0;
  auVar41._0_8_ = *(ulong *)(prim + uVar26 * 9 + 6);
  auVar40 = vpmovsxwd_avx(auVar41);
  auVar40 = vcvtdq2ps_avx(auVar40);
  auVar40 = vsubps_avx512vl(auVar40,auVar39);
  auVar56._0_4_ = auVar37._0_4_ * auVar40._0_4_;
  auVar56._4_4_ = auVar37._4_4_ * auVar40._4_4_;
  auVar56._8_4_ = auVar37._8_4_ * auVar40._8_4_;
  auVar56._12_4_ = auVar37._12_4_ * auVar40._12_4_;
  auVar37._8_8_ = 0;
  auVar37._0_8_ = *(ulong *)(prim + uVar26 * 0xe + 6);
  auVar40 = vpmovsxwd_avx(auVar37);
  auVar40 = vcvtdq2ps_avx(auVar40);
  auVar40 = vsubps_avx(auVar40,auVar11);
  auVar59._0_4_ = auVar38._0_4_ * auVar40._0_4_;
  auVar59._4_4_ = auVar38._4_4_ * auVar40._4_4_;
  auVar59._8_4_ = auVar38._8_4_ * auVar40._8_4_;
  auVar59._12_4_ = auVar38._12_4_ * auVar40._12_4_;
  auVar37 = vpbroadcastd_avx512vl();
  auVar43._8_8_ = 0;
  auVar43._0_8_ = *(ulong *)(prim + (ulong)(byte)prim[1] * 0x10 + 6);
  auVar40 = vpmovsxwd_avx(auVar43);
  auVar40 = vcvtdq2ps_avx(auVar40);
  auVar41 = vsubps_avx(auVar40,auVar11);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar26 * 0x15 + 6);
  auVar40 = vpmovsxwd_avx(auVar11);
  auVar50._0_4_ = auVar38._0_4_ * auVar41._0_4_;
  auVar50._4_4_ = auVar38._4_4_ * auVar41._4_4_;
  auVar50._8_4_ = auVar38._8_4_ * auVar41._8_4_;
  auVar50._12_4_ = auVar38._12_4_ * auVar41._12_4_;
  auVar40 = vcvtdq2ps_avx(auVar40);
  auVar40 = vsubps_avx(auVar40,auVar52);
  auVar54._0_4_ = auVar53._0_4_ * auVar40._0_4_;
  auVar54._4_4_ = auVar53._4_4_ * auVar40._4_4_;
  auVar54._8_4_ = auVar53._8_4_ * auVar40._8_4_;
  auVar54._12_4_ = auVar53._12_4_ * auVar40._12_4_;
  auVar38._8_8_ = 0;
  auVar38._0_8_ = *(ulong *)(prim + uVar26 * 0x17 + 6);
  auVar40 = vpmovsxwd_avx(auVar38);
  auVar40 = vcvtdq2ps_avx(auVar40);
  auVar40 = vsubps_avx(auVar40,auVar52);
  auVar48._0_4_ = auVar53._0_4_ * auVar40._0_4_;
  auVar48._4_4_ = auVar53._4_4_ * auVar40._4_4_;
  auVar48._8_4_ = auVar53._8_4_ * auVar40._8_4_;
  auVar48._12_4_ = auVar53._12_4_ * auVar40._12_4_;
  auVar40 = vpminsd_avx(auVar58,auVar56);
  auVar41 = vpminsd_avx(auVar59,auVar50);
  auVar40 = vmaxps_avx(auVar40,auVar41);
  auVar41 = vpminsd_avx(auVar54,auVar48);
  uVar126 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar53._4_4_ = uVar126;
  auVar53._0_4_ = uVar126;
  auVar53._8_4_ = uVar126;
  auVar53._12_4_ = uVar126;
  auVar41 = vmaxps_avx512vl(auVar41,auVar53);
  auVar40 = vmaxps_avx(auVar40,auVar41);
  auVar52._8_4_ = 0x3f7ffffa;
  auVar52._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar52._12_4_ = 0x3f7ffffa;
  auVar43 = vmulps_avx512vl(auVar40,auVar52);
  auVar40 = vpmaxsd_avx(auVar58,auVar56);
  auVar41 = vpmaxsd_avx(auVar59,auVar50);
  auVar40 = vminps_avx(auVar40,auVar41);
  auVar41 = vpmaxsd_avx(auVar54,auVar48);
  uVar126 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar39._4_4_ = uVar126;
  auVar39._0_4_ = uVar126;
  auVar39._8_4_ = uVar126;
  auVar39._12_4_ = uVar126;
  auVar41 = vminps_avx512vl(auVar41,auVar39);
  auVar40 = vminps_avx(auVar40,auVar41);
  auVar51._8_4_ = 0x3f800003;
  auVar51._0_8_ = 0x3f8000033f800003;
  auVar51._12_4_ = 0x3f800003;
  auVar40 = vmulps_avx512vl(auVar40,auVar51);
  uVar12 = vcmpps_avx512vl(auVar43,auVar40,2);
  uVar13 = vpcmpgtd_avx512vl(auVar37,_DAT_01f4ad30);
  uVar30 = CONCAT44((int)((ulong)unaff_RBP >> 0x20),(uint)((byte)uVar12 & 0xf & (byte)uVar13));
  auVar40 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  auVar41 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar245 = ZEXT1664(auVar41);
  auVar41 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
  auVar237 = ZEXT1664(auVar41);
  auVar244 = ZEXT464(0x3f800000);
  auVar41 = vxorps_avx512vl(in_ZMM29._0_16_,in_ZMM29._0_16_);
  auVar243 = ZEXT1664(auVar41);
LAB_018110cb:
  if (uVar30 == 0) {
    return;
  }
  lVar27 = 0;
  for (uVar26 = uVar30; (uVar26 & 1) == 0; uVar26 = uVar26 >> 1 | 0x8000000000000000) {
    lVar27 = lVar27 + 1;
  }
  uVar4 = *(uint *)(prim + 2);
  uVar5 = *(uint *)(prim + lVar27 * 4 + 6);
  pGVar7 = (context->scene->geometries).items[uVar4].ptr;
  uVar26 = (ulong)*(uint *)(*(long *)&pGVar7->field_0x58 +
                           pGVar7[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)uVar5);
  p_Var8 = pGVar7[1].intersectionFilterN;
  pvVar9 = pGVar7[2].userPtr;
  _Var10 = pGVar7[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar41 = *(undefined1 (*) [16])(_Var10 + uVar26 * (long)pvVar9);
  auVar37 = *(undefined1 (*) [16])(_Var10 + (uVar26 + 1) * (long)pvVar9);
  auVar11 = *(undefined1 (*) [16])(_Var10 + (uVar26 + 2) * (long)pvVar9);
  auVar38 = *(undefined1 (*) [16])(_Var10 + (long)pvVar9 * (uVar26 + 3));
  lVar27 = *(long *)&pGVar7[1].time_range.upper;
  auVar53 = *(undefined1 (*) [16])(lVar27 + (long)p_Var8 * uVar26);
  auVar52 = *(undefined1 (*) [16])(lVar27 + (long)p_Var8 * (uVar26 + 1));
  auVar39 = *(undefined1 (*) [16])(lVar27 + (long)p_Var8 * (uVar26 + 2));
  uVar30 = uVar30 - 1 & uVar30;
  auVar51 = *(undefined1 (*) [16])(lVar27 + (long)p_Var8 * (uVar26 + 3));
  if (uVar30 != 0) {
    uVar31 = uVar30 - 1 & uVar30;
    for (uVar26 = uVar30; (uVar26 & 1) == 0; uVar26 = uVar26 >> 1 | 0x8000000000000000) {
    }
    if (uVar31 != 0) {
      for (; (uVar31 & 1) == 0; uVar31 = uVar31 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar42 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x1c);
  auVar42 = vinsertps_avx(auVar42,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  fVar120 = *(float *)(ray + k * 4 + 0x30);
  auVar83 = auVar245._0_16_;
  auVar44 = vmulps_avx512vl(auVar51,auVar83);
  auVar62._0_12_ = ZEXT812(0);
  auVar62._12_4_ = 0;
  auVar46 = vfmadd213ps_fma(auVar62,auVar39,auVar44);
  auVar63._0_4_ = auVar52._0_4_ + auVar46._0_4_;
  auVar63._4_4_ = auVar52._4_4_ + auVar46._4_4_;
  auVar63._8_4_ = auVar52._8_4_ + auVar46._8_4_;
  auVar63._12_4_ = auVar52._12_4_ + auVar46._12_4_;
  auVar45 = vfmadd231ps_avx512vl(auVar63,auVar53,auVar83);
  auVar128 = ZEXT816(0) << 0x40;
  auVar69._0_4_ = auVar51._0_4_ * 0.0;
  auVar69._4_4_ = auVar51._4_4_ * 0.0;
  auVar69._8_4_ = auVar51._8_4_ * 0.0;
  auVar69._12_4_ = auVar51._12_4_ * 0.0;
  auVar135 = auVar237._0_16_;
  auVar46 = vfmadd231ps_avx512vl(auVar69,auVar39,auVar135);
  auVar46 = vfmadd231ps_fma(auVar46,auVar52,auVar128);
  auVar47 = vfnmadd231ps_avx512vl(auVar46,auVar53,auVar135);
  auVar48 = vmulps_avx512vl(auVar38,auVar83);
  auVar46 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar11,auVar48);
  auVar218._0_4_ = auVar46._0_4_ + auVar37._0_4_;
  auVar218._4_4_ = auVar46._4_4_ + auVar37._4_4_;
  auVar218._8_4_ = auVar46._8_4_ + auVar37._8_4_;
  auVar218._12_4_ = auVar46._12_4_ + auVar37._12_4_;
  auVar49 = vfmadd231ps_avx512vl(auVar218,auVar41,auVar83);
  auVar228._0_4_ = auVar38._0_4_ * 0.0;
  auVar228._4_4_ = auVar38._4_4_ * 0.0;
  auVar228._8_4_ = auVar38._8_4_ * 0.0;
  auVar228._12_4_ = auVar38._12_4_ * 0.0;
  auVar46 = vfmadd231ps_avx512vl(auVar228,auVar11,auVar135);
  auVar46 = vfmadd231ps_fma(auVar46,auVar37,auVar128);
  auVar50 = vfnmadd231ps_avx512vl(auVar46,auVar41,auVar135);
  auVar71._0_4_ = auVar39._0_4_ + auVar44._0_4_;
  auVar71._4_4_ = auVar39._4_4_ + auVar44._4_4_;
  auVar71._8_4_ = auVar39._8_4_ + auVar44._8_4_;
  auVar71._12_4_ = auVar39._12_4_ + auVar44._12_4_;
  auVar46 = vfmadd231ps_fma(auVar71,auVar52,auVar128);
  auVar46 = vfmadd231ps_avx512vl(auVar46,auVar53,auVar83);
  auVar51 = vmulps_avx512vl(auVar51,auVar135);
  auVar39 = vfmadd231ps_fma(auVar51,auVar128,auVar39);
  auVar52 = vfnmadd231ps_avx512vl(auVar39,auVar135,auVar52);
  auVar39 = vfmadd231ps_fma(auVar52,auVar128,auVar53);
  auVar174._0_4_ = auVar48._0_4_ + auVar11._0_4_;
  auVar174._4_4_ = auVar48._4_4_ + auVar11._4_4_;
  auVar174._8_4_ = auVar48._8_4_ + auVar11._8_4_;
  auVar174._12_4_ = auVar48._12_4_ + auVar11._12_4_;
  auVar53 = vfmadd231ps_fma(auVar174,auVar37,auVar128);
  auVar53 = vfmadd231ps_avx512vl(auVar53,auVar41,auVar83);
  auVar38 = vmulps_avx512vl(auVar38,auVar135);
  auVar11 = vfmadd231ps_fma(auVar38,auVar128,auVar11);
  auVar37 = vfnmadd231ps_avx512vl(auVar11,auVar135,auVar37);
  auVar52 = vfmadd231ps_fma(auVar37,auVar128,auVar41);
  auVar41 = vshufps_avx(auVar47,auVar47,0xc9);
  auVar37 = vshufps_avx(auVar49,auVar49,0xc9);
  fVar203 = auVar47._0_4_;
  auVar79._0_4_ = fVar203 * auVar37._0_4_;
  fVar132 = auVar47._4_4_;
  auVar79._4_4_ = fVar132 * auVar37._4_4_;
  fVar133 = auVar47._8_4_;
  auVar79._8_4_ = fVar133 * auVar37._8_4_;
  fVar134 = auVar47._12_4_;
  auVar79._12_4_ = fVar134 * auVar37._12_4_;
  auVar37 = vfmsub231ps_fma(auVar79,auVar41,auVar49);
  auVar11 = vshufps_avx(auVar37,auVar37,0xc9);
  auVar37 = vshufps_avx(auVar50,auVar50,0xc9);
  auVar82._0_4_ = fVar203 * auVar37._0_4_;
  auVar82._4_4_ = fVar132 * auVar37._4_4_;
  auVar82._8_4_ = fVar133 * auVar37._8_4_;
  auVar82._12_4_ = fVar134 * auVar37._12_4_;
  auVar41 = vfmsub231ps_fma(auVar82,auVar41,auVar50);
  auVar38 = vshufps_avx(auVar41,auVar41,0xc9);
  auVar41 = vshufps_avx(auVar39,auVar39,0xc9);
  auVar37 = vshufps_avx(auVar53,auVar53,0xc9);
  fVar142 = auVar39._0_4_;
  auVar84._0_4_ = fVar142 * auVar37._0_4_;
  fVar145 = auVar39._4_4_;
  auVar84._4_4_ = fVar145 * auVar37._4_4_;
  fVar146 = auVar39._8_4_;
  auVar84._8_4_ = fVar146 * auVar37._8_4_;
  fVar147 = auVar39._12_4_;
  auVar84._12_4_ = fVar147 * auVar37._12_4_;
  auVar37 = vfmsub231ps_fma(auVar84,auVar41,auVar53);
  auVar53 = vshufps_avx(auVar37,auVar37,0xc9);
  auVar37 = vshufps_avx(auVar52,auVar52,0xc9);
  auVar175._0_4_ = auVar37._0_4_ * fVar142;
  auVar175._4_4_ = auVar37._4_4_ * fVar145;
  auVar175._8_4_ = auVar37._8_4_ * fVar146;
  auVar175._12_4_ = auVar37._12_4_ * fVar147;
  auVar37 = vfmsub231ps_fma(auVar175,auVar41,auVar52);
  auVar41 = vdpps_avx(auVar11,auVar11,0x7f);
  auVar52 = vshufps_avx(auVar37,auVar37,0xc9);
  fVar204 = auVar41._0_4_;
  auVar176._4_12_ = ZEXT812(0) << 0x20;
  auVar176._0_4_ = fVar204;
  auVar37 = vrsqrt14ss_avx512f(auVar128,auVar176);
  auVar51 = vmulss_avx512f(auVar37,ZEXT416(0x3fc00000));
  auVar44 = vmulss_avx512f(auVar41,ZEXT416(0xbf000000));
  fVar125 = auVar37._0_4_;
  auVar37 = vdpps_avx(auVar11,auVar38,0x7f);
  fVar125 = auVar51._0_4_ + auVar44._0_4_ * fVar125 * fVar125 * fVar125;
  fVar205 = fVar125 * auVar11._0_4_;
  fVar214 = fVar125 * auVar11._4_4_;
  fVar215 = fVar125 * auVar11._8_4_;
  fVar216 = fVar125 * auVar11._12_4_;
  auVar186._0_4_ = auVar38._0_4_ * fVar204;
  auVar186._4_4_ = auVar38._4_4_ * fVar204;
  auVar186._8_4_ = auVar38._8_4_ * fVar204;
  auVar186._12_4_ = auVar38._12_4_ * fVar204;
  fVar204 = auVar37._0_4_;
  auVar85._0_4_ = fVar204 * auVar11._0_4_;
  auVar85._4_4_ = fVar204 * auVar11._4_4_;
  auVar85._8_4_ = fVar204 * auVar11._8_4_;
  auVar85._12_4_ = fVar204 * auVar11._12_4_;
  auVar11 = vsubps_avx(auVar186,auVar85);
  auVar37 = vrcp14ss_avx512f(auVar128,auVar176);
  auVar41 = vfnmadd213ss_avx512f(auVar41,auVar37,ZEXT416(0x40000000));
  fVar193 = auVar37._0_4_ * auVar41._0_4_;
  auVar41 = vdpps_avx(auVar53,auVar53,0x7f);
  fVar202 = auVar41._0_4_;
  auVar177._4_12_ = ZEXT812(0) << 0x20;
  auVar177._0_4_ = fVar202;
  auVar37 = vrsqrt14ss_avx512f(auVar128,auVar177);
  auVar38 = vmulss_avx512f(auVar37,ZEXT416(0x3fc00000));
  auVar51 = vmulss_avx512f(auVar41,ZEXT416(0xbf000000));
  fVar204 = auVar37._0_4_;
  fVar204 = auVar38._0_4_ + auVar51._0_4_ * fVar204 * fVar204 * fVar204;
  auVar37 = vdpps_avx(auVar53,auVar52,0x7f);
  fVar217 = fVar204 * auVar53._0_4_;
  fVar225 = fVar204 * auVar53._4_4_;
  fVar226 = fVar204 * auVar53._8_4_;
  fVar227 = fVar204 * auVar53._12_4_;
  auVar81._0_4_ = fVar202 * auVar52._0_4_;
  auVar81._4_4_ = fVar202 * auVar52._4_4_;
  auVar81._8_4_ = fVar202 * auVar52._8_4_;
  auVar81._12_4_ = fVar202 * auVar52._12_4_;
  fVar202 = auVar37._0_4_;
  auVar78._0_4_ = fVar202 * auVar53._0_4_;
  auVar78._4_4_ = fVar202 * auVar53._4_4_;
  auVar78._8_4_ = fVar202 * auVar53._8_4_;
  auVar78._12_4_ = fVar202 * auVar53._12_4_;
  auVar38 = vsubps_avx(auVar81,auVar78);
  auVar37 = vrcp14ss_avx512f(auVar128,auVar177);
  auVar41 = vfnmadd213ss_avx512f(auVar41,auVar37,ZEXT416(0x40000000));
  fVar202 = auVar41._0_4_ * auVar37._0_4_;
  auVar41 = vshufps_avx(auVar45,auVar45,0xff);
  auVar165._0_4_ = fVar205 * auVar41._0_4_;
  auVar165._4_4_ = fVar214 * auVar41._4_4_;
  auVar165._8_4_ = fVar215 * auVar41._8_4_;
  auVar165._12_4_ = fVar216 * auVar41._12_4_;
  auVar52 = vsubps_avx(auVar45,auVar165);
  auVar37 = vshufps_avx(auVar47,auVar47,0xff);
  auVar154._0_4_ = auVar37._0_4_ * fVar205 + auVar41._0_4_ * fVar125 * fVar193 * auVar11._0_4_;
  auVar154._4_4_ = auVar37._4_4_ * fVar214 + auVar41._4_4_ * fVar125 * fVar193 * auVar11._4_4_;
  auVar154._8_4_ = auVar37._8_4_ * fVar215 + auVar41._8_4_ * fVar125 * fVar193 * auVar11._8_4_;
  auVar154._12_4_ = auVar37._12_4_ * fVar216 + auVar41._12_4_ * fVar125 * fVar193 * auVar11._12_4_;
  auVar11 = vsubps_avx(auVar47,auVar154);
  auVar232._0_4_ = auVar165._0_4_ + auVar45._0_4_;
  auVar232._4_4_ = auVar165._4_4_ + auVar45._4_4_;
  auVar232._8_4_ = auVar165._8_4_ + auVar45._8_4_;
  auVar232._12_4_ = auVar165._12_4_ + auVar45._12_4_;
  auVar41 = vshufps_avx(auVar46,auVar46,0xff);
  auVar155._0_4_ = fVar217 * auVar41._0_4_;
  auVar155._4_4_ = fVar225 * auVar41._4_4_;
  auVar155._8_4_ = fVar226 * auVar41._8_4_;
  auVar155._12_4_ = fVar227 * auVar41._12_4_;
  auVar54 = vsubps_avx512vl(auVar46,auVar155);
  auVar37 = vshufps_avx(auVar39,auVar39,0xff);
  auVar70._0_4_ = auVar37._0_4_ * fVar217 + auVar41._0_4_ * fVar204 * auVar38._0_4_ * fVar202;
  auVar70._4_4_ = auVar37._4_4_ * fVar225 + auVar41._4_4_ * fVar204 * auVar38._4_4_ * fVar202;
  auVar70._8_4_ = auVar37._8_4_ * fVar226 + auVar41._8_4_ * fVar204 * auVar38._8_4_ * fVar202;
  auVar70._12_4_ = auVar37._12_4_ * fVar227 + auVar41._12_4_ * fVar204 * auVar38._12_4_ * fVar202;
  auVar41 = vsubps_avx(auVar39,auVar70);
  auVar219._0_4_ = auVar46._0_4_ + auVar155._0_4_;
  auVar219._4_4_ = auVar46._4_4_ + auVar155._4_4_;
  auVar219._8_4_ = auVar46._8_4_ + auVar155._8_4_;
  auVar219._12_4_ = auVar46._12_4_ + auVar155._12_4_;
  auVar72._0_4_ = auVar11._0_4_ * 0.33333334;
  auVar72._4_4_ = auVar11._4_4_ * 0.33333334;
  auVar72._8_4_ = auVar11._8_4_ * 0.33333334;
  auVar72._12_4_ = auVar11._12_4_ * 0.33333334;
  auVar55 = vaddps_avx512vl(auVar52,auVar72);
  auVar73._0_4_ = auVar41._0_4_ * 0.33333334;
  auVar73._4_4_ = auVar41._4_4_ * 0.33333334;
  auVar73._8_4_ = auVar41._8_4_ * 0.33333334;
  auVar73._12_4_ = auVar41._12_4_ * 0.33333334;
  auVar56 = vsubps_avx512vl(auVar54,auVar73);
  auVar66._0_4_ = (fVar203 + auVar154._0_4_) * 0.33333334;
  auVar66._4_4_ = (fVar132 + auVar154._4_4_) * 0.33333334;
  auVar66._8_4_ = (fVar133 + auVar154._8_4_) * 0.33333334;
  auVar66._12_4_ = (fVar134 + auVar154._12_4_) * 0.33333334;
  auVar57 = vaddps_avx512vl(auVar232,auVar66);
  auVar67._0_4_ = (fVar142 + auVar70._0_4_) * 0.33333334;
  auVar67._4_4_ = (fVar145 + auVar70._4_4_) * 0.33333334;
  auVar67._8_4_ = (fVar146 + auVar70._8_4_) * 0.33333334;
  auVar67._12_4_ = (fVar147 + auVar70._12_4_) * 0.33333334;
  auVar58 = vsubps_avx512vl(auVar219,auVar67);
  auVar39 = vsubps_avx(auVar52,auVar42);
  uVar126 = auVar39._0_4_;
  auVar80._4_4_ = uVar126;
  auVar80._0_4_ = uVar126;
  auVar80._8_4_ = uVar126;
  auVar80._12_4_ = uVar126;
  auVar41 = vshufps_avx(auVar39,auVar39,0x55);
  aVar2 = pre->ray_space[k].vx.field_0;
  aVar3 = pre->ray_space[k].vy.field_0;
  auVar37 = vshufps_avx(auVar39,auVar39,0xaa);
  fVar125 = pre->ray_space[k].vz.field_0.m128[0];
  fVar204 = pre->ray_space[k].vz.field_0.m128[1];
  fVar193 = pre->ray_space[k].vz.field_0.m128[2];
  fVar202 = pre->ray_space[k].vz.field_0.m128[3];
  auVar68._0_4_ = fVar125 * auVar37._0_4_;
  auVar68._4_4_ = fVar204 * auVar37._4_4_;
  auVar68._8_4_ = fVar193 * auVar37._8_4_;
  auVar68._12_4_ = fVar202 * auVar37._12_4_;
  auVar41 = vfmadd231ps_fma(auVar68,(undefined1  [16])aVar3,auVar41);
  auVar45 = vfmadd231ps_fma(auVar41,(undefined1  [16])aVar2,auVar80);
  auVar59 = vsubps_avx512vl(auVar55,auVar42);
  uVar126 = auVar59._0_4_;
  auVar75._4_4_ = uVar126;
  auVar75._0_4_ = uVar126;
  auVar75._8_4_ = uVar126;
  auVar75._12_4_ = uVar126;
  auVar41 = vshufps_avx(auVar59,auVar59,0x55);
  auVar37 = vshufps_avx(auVar59,auVar59,0xaa);
  auVar74._0_4_ = fVar125 * auVar37._0_4_;
  auVar74._4_4_ = fVar204 * auVar37._4_4_;
  auVar74._8_4_ = fVar193 * auVar37._8_4_;
  auVar74._12_4_ = fVar202 * auVar37._12_4_;
  auVar41 = vfmadd231ps_fma(auVar74,(undefined1  [16])aVar3,auVar41);
  auVar47 = vfmadd231ps_fma(auVar41,(undefined1  [16])aVar2,auVar75);
  auVar60 = vsubps_avx512vl(auVar56,auVar42);
  uVar126 = auVar60._0_4_;
  auVar76._4_4_ = uVar126;
  auVar76._0_4_ = uVar126;
  auVar76._8_4_ = uVar126;
  auVar76._12_4_ = uVar126;
  auVar41 = vshufps_avx(auVar60,auVar60,0x55);
  auVar37 = vshufps_avx(auVar60,auVar60,0xaa);
  auVar87._0_4_ = fVar125 * auVar37._0_4_;
  auVar87._4_4_ = fVar204 * auVar37._4_4_;
  auVar87._8_4_ = fVar193 * auVar37._8_4_;
  auVar87._12_4_ = fVar202 * auVar37._12_4_;
  auVar41 = vfmadd231ps_fma(auVar87,(undefined1  [16])aVar3,auVar41);
  auVar48 = vfmadd231ps_fma(auVar41,(undefined1  [16])aVar2,auVar76);
  auVar61 = vsubps_avx512vl(auVar54,auVar42);
  uVar126 = auVar61._0_4_;
  auVar166._4_4_ = uVar126;
  auVar166._0_4_ = uVar126;
  auVar166._8_4_ = uVar126;
  auVar166._12_4_ = uVar126;
  auVar41 = vshufps_avx(auVar61,auVar61,0x55);
  auVar37 = vshufps_avx(auVar61,auVar61,0xaa);
  auVar77._0_4_ = fVar125 * auVar37._0_4_;
  auVar77._4_4_ = fVar204 * auVar37._4_4_;
  auVar77._8_4_ = fVar193 * auVar37._8_4_;
  auVar77._12_4_ = fVar202 * auVar37._12_4_;
  auVar41 = vfmadd231ps_fma(auVar77,(undefined1  [16])aVar3,auVar41);
  auVar49 = vfmadd231ps_fma(auVar41,(undefined1  [16])aVar2,auVar166);
  auVar51 = vsubps_avx(auVar232,auVar42);
  uVar126 = auVar51._0_4_;
  auVar167._4_4_ = uVar126;
  auVar167._0_4_ = uVar126;
  auVar167._8_4_ = uVar126;
  auVar167._12_4_ = uVar126;
  auVar41 = vshufps_avx(auVar51,auVar51,0x55);
  auVar37 = vshufps_avx(auVar51,auVar51,0xaa);
  auVar187._0_4_ = auVar37._0_4_ * fVar125;
  auVar187._4_4_ = auVar37._4_4_ * fVar204;
  auVar187._8_4_ = auVar37._8_4_ * fVar193;
  auVar187._12_4_ = auVar37._12_4_ * fVar202;
  auVar41 = vfmadd231ps_fma(auVar187,(undefined1  [16])aVar3,auVar41);
  auVar50 = vfmadd231ps_fma(auVar41,(undefined1  [16])aVar2,auVar167);
  auVar62 = vsubps_avx512vl(auVar57,auVar42);
  uVar126 = auVar62._0_4_;
  auVar168._4_4_ = uVar126;
  auVar168._0_4_ = uVar126;
  auVar168._8_4_ = uVar126;
  auVar168._12_4_ = uVar126;
  auVar41 = vshufps_avx(auVar62,auVar62,0x55);
  auVar37 = vshufps_avx(auVar62,auVar62,0xaa);
  auVar194._0_4_ = auVar37._0_4_ * fVar125;
  auVar194._4_4_ = auVar37._4_4_ * fVar204;
  auVar194._8_4_ = auVar37._8_4_ * fVar193;
  auVar194._12_4_ = auVar37._12_4_ * fVar202;
  auVar41 = vfmadd231ps_fma(auVar194,(undefined1  [16])aVar3,auVar41);
  auVar128 = vfmadd231ps_fma(auVar41,(undefined1  [16])aVar2,auVar168);
  auVar63 = vsubps_avx512vl(auVar58,auVar42);
  uVar126 = auVar63._0_4_;
  auVar169._4_4_ = uVar126;
  auVar169._0_4_ = uVar126;
  auVar169._8_4_ = uVar126;
  auVar169._12_4_ = uVar126;
  auVar41 = vshufps_avx(auVar63,auVar63,0x55);
  auVar37 = vshufps_avx(auVar63,auVar63,0xaa);
  auVar206._0_4_ = auVar37._0_4_ * fVar125;
  auVar206._4_4_ = auVar37._4_4_ * fVar204;
  auVar206._8_4_ = auVar37._8_4_ * fVar193;
  auVar206._12_4_ = auVar37._12_4_ * fVar202;
  auVar41 = vfmadd231ps_fma(auVar206,(undefined1  [16])aVar3,auVar41);
  auVar135 = vfmadd231ps_fma(auVar41,(undefined1  [16])aVar2,auVar169);
  auVar42 = vsubps_avx(auVar219,auVar42);
  uVar126 = auVar42._0_4_;
  auVar64._4_4_ = uVar126;
  auVar64._0_4_ = uVar126;
  auVar64._8_4_ = uVar126;
  auVar64._12_4_ = uVar126;
  auVar41 = vshufps_avx(auVar42,auVar42,0x55);
  auVar37 = vshufps_avx(auVar42,auVar42,0xaa);
  auVar86._0_4_ = auVar37._0_4_ * fVar125;
  auVar86._4_4_ = auVar37._4_4_ * fVar204;
  auVar86._8_4_ = auVar37._8_4_ * fVar193;
  auVar86._12_4_ = auVar37._12_4_ * fVar202;
  auVar41 = vfmadd231ps_fma(auVar86,(undefined1  [16])aVar3,auVar41);
  auVar136 = vfmadd231ps_fma(auVar41,(undefined1  [16])aVar2,auVar64);
  auVar11 = vmovlhps_avx(auVar45,auVar50);
  auVar38 = vmovlhps_avx(auVar47,auVar128);
  auVar46 = vmovlhps_avx512f(auVar48,auVar135);
  auVar44 = vmovlhps_avx512f(auVar49,auVar136);
  auVar37 = vminps_avx(auVar11,auVar38);
  auVar41 = vmaxps_avx(auVar11,auVar38);
  auVar53 = vminps_avx512vl(auVar46,auVar44);
  auVar37 = vminps_avx(auVar37,auVar53);
  auVar53 = vmaxps_avx512vl(auVar46,auVar44);
  auVar41 = vmaxps_avx(auVar41,auVar53);
  auVar53 = vshufpd_avx(auVar37,auVar37,3);
  auVar37 = vminps_avx(auVar37,auVar53);
  auVar53 = vshufpd_avx(auVar41,auVar41,3);
  auVar41 = vmaxps_avx(auVar41,auVar53);
  auVar37 = vandps_avx512vl(auVar37,auVar241._0_16_);
  auVar41 = vandps_avx512vl(auVar41,auVar241._0_16_);
  auVar41 = vmaxps_avx(auVar37,auVar41);
  auVar37 = vmovshdup_avx(auVar41);
  auVar41 = vmaxss_avx(auVar37,auVar41);
  fVar125 = auVar41._0_4_ * 9.536743e-07;
  auVar45 = vmovddup_avx512vl(auVar45);
  auVar47 = vmovddup_avx512vl(auVar47);
  auVar48 = vmovddup_avx512vl(auVar48);
  auVar49 = vmovddup_avx512vl(auVar49);
  auVar65._4_4_ = fVar125;
  auVar65._0_4_ = fVar125;
  auVar65._8_4_ = fVar125;
  auVar65._12_4_ = fVar125;
  local_78._16_4_ = fVar125;
  local_78._0_16_ = auVar65;
  local_78._20_4_ = fVar125;
  local_78._24_4_ = fVar125;
  local_78._28_4_ = fVar125;
  auVar41 = vxorps_avx512vl(auVar65,auVar83);
  local_98 = auVar41._0_4_;
  uStack_94 = local_98;
  uStack_90 = local_98;
  uStack_8c = local_98;
  uStack_88 = local_98;
  uStack_84 = local_98;
  uStack_80 = local_98;
  uStack_7c = local_98;
  uVar26 = 0;
  auVar41 = vsubps_avx(auVar38,auVar11);
  auVar64 = vsubps_avx512vl(auVar46,auVar38);
  auVar65 = vsubps_avx512vl(auVar44,auVar46);
  auVar37 = vsubps_avx(auVar232,auVar52);
  auVar66 = vsubps_avx512vl(auVar57,auVar55);
  auVar67 = vsubps_avx512vl(auVar58,auVar56);
  auVar68 = vsubps_avx512vl(auVar219,auVar54);
  auVar69 = vpbroadcastd_avx512vl();
  auVar70 = vpbroadcastd_avx512vl();
  auVar53 = ZEXT816(0x3f80000000000000);
  auVar83 = auVar53;
LAB_01811815:
  do {
    auVar80 = vshufps_avx(auVar83,auVar83,0x50);
    auVar229._8_4_ = 0x3f800000;
    auVar229._0_8_ = 0x3f8000003f800000;
    auVar229._12_4_ = 0x3f800000;
    auVar108._16_4_ = 0x3f800000;
    auVar108._0_16_ = auVar229;
    auVar108._20_4_ = 0x3f800000;
    auVar108._24_4_ = 0x3f800000;
    auVar108._28_4_ = 0x3f800000;
    auVar74 = vsubps_avx(auVar229,auVar80);
    fVar204 = auVar80._0_4_;
    fVar132 = auVar50._0_4_;
    auVar143._0_4_ = fVar132 * fVar204;
    fVar193 = auVar80._4_4_;
    fVar133 = auVar50._4_4_;
    auVar143._4_4_ = fVar133 * fVar193;
    fVar202 = auVar80._8_4_;
    auVar143._8_4_ = fVar132 * fVar202;
    fVar203 = auVar80._12_4_;
    auVar143._12_4_ = fVar133 * fVar203;
    fVar134 = auVar128._0_4_;
    auVar148._0_4_ = fVar134 * fVar204;
    fVar142 = auVar128._4_4_;
    auVar148._4_4_ = fVar142 * fVar193;
    auVar148._8_4_ = fVar134 * fVar202;
    auVar148._12_4_ = fVar142 * fVar203;
    fVar145 = auVar135._0_4_;
    auVar156._0_4_ = fVar145 * fVar204;
    fVar146 = auVar135._4_4_;
    auVar156._4_4_ = fVar146 * fVar193;
    auVar156._8_4_ = fVar145 * fVar202;
    auVar156._12_4_ = fVar146 * fVar203;
    fVar147 = auVar136._0_4_;
    auVar129._0_4_ = fVar147 * fVar204;
    fVar205 = auVar136._4_4_;
    auVar129._4_4_ = fVar205 * fVar193;
    auVar129._8_4_ = fVar147 * fVar202;
    auVar129._12_4_ = fVar205 * fVar203;
    auVar71 = vfmadd231ps_avx512vl(auVar143,auVar74,auVar45);
    auVar72 = vfmadd231ps_avx512vl(auVar148,auVar74,auVar47);
    auVar73 = vfmadd231ps_avx512vl(auVar156,auVar74,auVar48);
    auVar74 = vfmadd231ps_avx512vl(auVar129,auVar49,auVar74);
    auVar80 = vmovshdup_avx(auVar53);
    fVar193 = auVar53._0_4_;
    fVar204 = (auVar80._0_4_ - fVar193) * 0.04761905;
    auVar102._4_4_ = fVar193;
    auVar102._0_4_ = fVar193;
    auVar102._8_4_ = fVar193;
    auVar102._12_4_ = fVar193;
    auVar102._16_4_ = fVar193;
    auVar102._20_4_ = fVar193;
    auVar102._24_4_ = fVar193;
    auVar102._28_4_ = fVar193;
    auVar92._0_8_ = auVar80._0_8_;
    auVar92._8_8_ = auVar92._0_8_;
    auVar92._16_8_ = auVar92._0_8_;
    auVar92._24_8_ = auVar92._0_8_;
    auVar105 = vsubps_avx(auVar92,auVar102);
    uVar126 = auVar71._0_4_;
    auVar106._4_4_ = uVar126;
    auVar106._0_4_ = uVar126;
    auVar106._8_4_ = uVar126;
    auVar106._12_4_ = uVar126;
    auVar106._16_4_ = uVar126;
    auVar106._20_4_ = uVar126;
    auVar106._24_4_ = uVar126;
    auVar106._28_4_ = uVar126;
    auVar94._8_4_ = 1;
    auVar94._0_8_ = 0x100000001;
    auVar94._12_4_ = 1;
    auVar94._16_4_ = 1;
    auVar94._20_4_ = 1;
    auVar94._24_4_ = 1;
    auVar94._28_4_ = 1;
    auVar104 = ZEXT1632(auVar71);
    auVar103 = vpermps_avx2(auVar94,auVar104);
    auVar88 = vbroadcastss_avx512vl(auVar72);
    auVar98 = ZEXT1632(auVar72);
    auVar89 = vpermps_avx512vl(auVar94,auVar98);
    auVar90 = vbroadcastss_avx512vl(auVar73);
    auVar99 = ZEXT1632(auVar73);
    auVar91 = vpermps_avx512vl(auVar94,auVar99);
    auVar92 = vbroadcastss_avx512vl(auVar74);
    auVar101 = ZEXT1632(auVar74);
    auVar93 = vpermps_avx512vl(auVar94,auVar101);
    auVar107._4_4_ = fVar204;
    auVar107._0_4_ = fVar204;
    auVar107._8_4_ = fVar204;
    auVar107._12_4_ = fVar204;
    auVar107._16_4_ = fVar204;
    auVar107._20_4_ = fVar204;
    auVar107._24_4_ = fVar204;
    auVar107._28_4_ = fVar204;
    auVar100._8_4_ = 2;
    auVar100._0_8_ = 0x200000002;
    auVar100._12_4_ = 2;
    auVar100._16_4_ = 2;
    auVar100._20_4_ = 2;
    auVar100._24_4_ = 2;
    auVar100._28_4_ = 2;
    auVar94 = vpermps_avx512vl(auVar100,auVar104);
    auVar95 = vbroadcastss_avx512vl(ZEXT416(3));
    auVar96 = vpermps_avx512vl(auVar95,auVar104);
    auVar97 = vpermps_avx512vl(auVar100,auVar98);
    auVar98 = vpermps_avx512vl(auVar95,auVar98);
    auVar104 = vpermps_avx2(auVar100,auVar99);
    auVar99 = vpermps_avx512vl(auVar95,auVar99);
    auVar100 = vpermps_avx512vl(auVar100,auVar101);
    auVar95 = vpermps_avx512vl(auVar95,auVar101);
    auVar80 = vfmadd132ps_fma(auVar105,auVar102,_DAT_01f7b040);
    auVar105 = vsubps_avx(auVar108,ZEXT1632(auVar80));
    auVar101 = vmulps_avx512vl(auVar88,ZEXT1632(auVar80));
    auVar108 = ZEXT1632(auVar80);
    auVar102 = vmulps_avx512vl(auVar89,auVar108);
    auVar74 = vfmadd231ps_fma(auVar101,auVar105,auVar106);
    auVar71 = vfmadd231ps_fma(auVar102,auVar105,auVar103);
    auVar101 = vmulps_avx512vl(auVar90,auVar108);
    auVar102 = vmulps_avx512vl(auVar91,auVar108);
    auVar101 = vfmadd231ps_avx512vl(auVar101,auVar105,auVar88);
    auVar102 = vfmadd231ps_avx512vl(auVar102,auVar105,auVar89);
    auVar88 = vmulps_avx512vl(auVar92,auVar108);
    auVar106 = ZEXT1632(auVar80);
    auVar89 = vmulps_avx512vl(auVar93,auVar106);
    auVar90 = vfmadd231ps_avx512vl(auVar88,auVar105,auVar90);
    auVar91 = vfmadd231ps_avx512vl(auVar89,auVar105,auVar91);
    fVar202 = auVar80._0_4_;
    fVar203 = auVar80._4_4_;
    auVar88._4_4_ = fVar203 * auVar101._4_4_;
    auVar88._0_4_ = fVar202 * auVar101._0_4_;
    fVar214 = auVar80._8_4_;
    auVar88._8_4_ = fVar214 * auVar101._8_4_;
    fVar215 = auVar80._12_4_;
    auVar88._12_4_ = fVar215 * auVar101._12_4_;
    auVar88._16_4_ = auVar101._16_4_ * 0.0;
    auVar88._20_4_ = auVar101._20_4_ * 0.0;
    auVar88._24_4_ = auVar101._24_4_ * 0.0;
    auVar88._28_4_ = fVar193;
    auVar89._4_4_ = fVar203 * auVar102._4_4_;
    auVar89._0_4_ = fVar202 * auVar102._0_4_;
    auVar89._8_4_ = fVar214 * auVar102._8_4_;
    auVar89._12_4_ = fVar215 * auVar102._12_4_;
    auVar89._16_4_ = auVar102._16_4_ * 0.0;
    auVar89._20_4_ = auVar102._20_4_ * 0.0;
    auVar89._24_4_ = auVar102._24_4_ * 0.0;
    auVar89._28_4_ = auVar103._28_4_;
    auVar74 = vfmadd231ps_fma(auVar88,auVar105,ZEXT1632(auVar74));
    auVar71 = vfmadd231ps_fma(auVar89,auVar105,ZEXT1632(auVar71));
    auVar93._0_4_ = fVar202 * auVar90._0_4_;
    auVar93._4_4_ = fVar203 * auVar90._4_4_;
    auVar93._8_4_ = fVar214 * auVar90._8_4_;
    auVar93._12_4_ = fVar215 * auVar90._12_4_;
    auVar93._16_4_ = auVar90._16_4_ * 0.0;
    auVar93._20_4_ = auVar90._20_4_ * 0.0;
    auVar93._24_4_ = auVar90._24_4_ * 0.0;
    auVar93._28_4_ = 0;
    auVar103._4_4_ = fVar203 * auVar91._4_4_;
    auVar103._0_4_ = fVar202 * auVar91._0_4_;
    auVar103._8_4_ = fVar214 * auVar91._8_4_;
    auVar103._12_4_ = fVar215 * auVar91._12_4_;
    auVar103._16_4_ = auVar91._16_4_ * 0.0;
    auVar103._20_4_ = auVar91._20_4_ * 0.0;
    auVar103._24_4_ = auVar91._24_4_ * 0.0;
    auVar103._28_4_ = auVar90._28_4_;
    auVar72 = vfmadd231ps_fma(auVar93,auVar105,auVar101);
    auVar73 = vfmadd231ps_fma(auVar103,auVar105,auVar102);
    auVar90._28_4_ = auVar102._28_4_;
    auVar90._0_28_ =
         ZEXT1628(CONCAT412(fVar215 * auVar73._12_4_,
                            CONCAT48(fVar214 * auVar73._8_4_,
                                     CONCAT44(fVar203 * auVar73._4_4_,fVar202 * auVar73._0_4_))));
    auVar75 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar215 * auVar72._12_4_,
                                                 CONCAT48(fVar214 * auVar72._8_4_,
                                                          CONCAT44(fVar203 * auVar72._4_4_,
                                                                   fVar202 * auVar72._0_4_)))),
                              auVar105,ZEXT1632(auVar74));
    auVar87 = vfmadd231ps_fma(auVar90,auVar105,ZEXT1632(auVar71));
    auVar103 = vsubps_avx(ZEXT1632(auVar72),ZEXT1632(auVar74));
    auVar88 = vsubps_avx(ZEXT1632(auVar73),ZEXT1632(auVar71));
    auVar89 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar103 = vmulps_avx512vl(auVar103,auVar89);
    auVar88 = vmulps_avx512vl(auVar88,auVar89);
    auVar101._0_4_ = fVar204 * auVar103._0_4_;
    auVar101._4_4_ = fVar204 * auVar103._4_4_;
    auVar101._8_4_ = fVar204 * auVar103._8_4_;
    auVar101._12_4_ = fVar204 * auVar103._12_4_;
    auVar101._16_4_ = fVar204 * auVar103._16_4_;
    auVar101._20_4_ = fVar204 * auVar103._20_4_;
    auVar101._24_4_ = fVar204 * auVar103._24_4_;
    auVar101._28_4_ = 0;
    auVar103 = vmulps_avx512vl(auVar107,auVar88);
    auVar71 = vxorps_avx512vl(auVar92._0_16_,auVar92._0_16_);
    auVar88 = vpermt2ps_avx512vl(ZEXT1632(auVar75),_DAT_01fb9fc0,ZEXT1632(auVar71));
    auVar90 = vpermt2ps_avx512vl(ZEXT1632(auVar87),_DAT_01fb9fc0,ZEXT1632(auVar71));
    auVar131._0_4_ = auVar101._0_4_ + auVar75._0_4_;
    auVar131._4_4_ = auVar101._4_4_ + auVar75._4_4_;
    auVar131._8_4_ = auVar101._8_4_ + auVar75._8_4_;
    auVar131._12_4_ = auVar101._12_4_ + auVar75._12_4_;
    auVar131._16_4_ = auVar101._16_4_ + 0.0;
    auVar131._20_4_ = auVar101._20_4_ + 0.0;
    auVar131._24_4_ = auVar101._24_4_ + 0.0;
    auVar131._28_4_ = 0;
    auVar102 = ZEXT1632(auVar71);
    auVar91 = vpermt2ps_avx512vl(auVar101,_DAT_01fb9fc0,auVar102);
    auVar92 = vaddps_avx512vl(ZEXT1632(auVar87),auVar103);
    auVar93 = vpermt2ps_avx512vl(auVar103,_DAT_01fb9fc0,auVar102);
    auVar103 = vsubps_avx(auVar88,auVar91);
    auVar93 = vsubps_avx512vl(auVar90,auVar93);
    auVar91 = vmulps_avx512vl(auVar97,auVar106);
    auVar101 = vmulps_avx512vl(auVar98,auVar106);
    auVar91 = vfmadd231ps_avx512vl(auVar91,auVar105,auVar94);
    auVar94 = vfmadd231ps_avx512vl(auVar101,auVar105,auVar96);
    auVar96 = vmulps_avx512vl(auVar104,auVar106);
    auVar101 = vmulps_avx512vl(auVar99,auVar106);
    auVar96 = vfmadd231ps_avx512vl(auVar96,auVar105,auVar97);
    auVar97 = vfmadd231ps_avx512vl(auVar101,auVar105,auVar98);
    auVar98 = vmulps_avx512vl(auVar100,auVar106);
    auVar95 = vmulps_avx512vl(auVar95,auVar106);
    auVar74 = vfmadd231ps_fma(auVar98,auVar105,auVar104);
    auVar104 = vfmadd231ps_avx512vl(auVar95,auVar105,auVar99);
    auVar95 = vmulps_avx512vl(auVar106,auVar96);
    auVar100 = ZEXT1632(auVar80);
    auVar98 = vmulps_avx512vl(auVar100,auVar97);
    auVar91 = vfmadd231ps_avx512vl(auVar95,auVar105,auVar91);
    auVar94 = vfmadd231ps_avx512vl(auVar98,auVar105,auVar94);
    auVar104 = vmulps_avx512vl(auVar100,auVar104);
    auVar95 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(fVar215 * auVar74._12_4_,
                                            CONCAT48(fVar214 * auVar74._8_4_,
                                                     CONCAT44(fVar203 * auVar74._4_4_,
                                                              fVar202 * auVar74._0_4_)))),auVar105,
                         auVar96);
    auVar96 = vfmadd231ps_avx512vl(auVar104,auVar105,auVar97);
    auVar104._4_4_ = fVar203 * auVar95._4_4_;
    auVar104._0_4_ = fVar202 * auVar95._0_4_;
    auVar104._8_4_ = fVar214 * auVar95._8_4_;
    auVar104._12_4_ = fVar215 * auVar95._12_4_;
    auVar104._16_4_ = auVar95._16_4_ * 0.0;
    auVar104._20_4_ = auVar95._20_4_ * 0.0;
    auVar104._24_4_ = auVar95._24_4_ * 0.0;
    auVar104._28_4_ = auVar99._28_4_;
    auVar97 = vmulps_avx512vl(auVar100,auVar96);
    auVar104 = vfmadd231ps_avx512vl(auVar104,auVar105,auVar91);
    auVar97 = vfmadd231ps_avx512vl(auVar97,auVar94,auVar105);
    auVar105 = vsubps_avx512vl(auVar95,auVar91);
    auVar91 = vsubps_avx512vl(auVar96,auVar94);
    auVar94 = vmulps_avx512vl(auVar105,auVar89);
    auVar89 = vmulps_avx512vl(auVar91,auVar89);
    fVar193 = fVar204 * auVar94._0_4_;
    fVar202 = fVar204 * auVar94._4_4_;
    auVar105._4_4_ = fVar202;
    auVar105._0_4_ = fVar193;
    fVar203 = fVar204 * auVar94._8_4_;
    auVar105._8_4_ = fVar203;
    fVar214 = fVar204 * auVar94._12_4_;
    auVar105._12_4_ = fVar214;
    fVar215 = fVar204 * auVar94._16_4_;
    auVar105._16_4_ = fVar215;
    fVar216 = fVar204 * auVar94._20_4_;
    auVar105._20_4_ = fVar216;
    fVar204 = fVar204 * auVar94._24_4_;
    auVar105._24_4_ = fVar204;
    auVar105._28_4_ = auVar94._28_4_;
    auVar89 = vmulps_avx512vl(auVar107,auVar89);
    auVar95 = vpermt2ps_avx512vl(auVar104,_DAT_01fb9fc0,auVar102);
    auVar96 = vpermt2ps_avx512vl(auVar97,_DAT_01fb9fc0,auVar102);
    auVar192._0_4_ = auVar104._0_4_ + fVar193;
    auVar192._4_4_ = auVar104._4_4_ + fVar202;
    auVar192._8_4_ = auVar104._8_4_ + fVar203;
    auVar192._12_4_ = auVar104._12_4_ + fVar214;
    auVar192._16_4_ = auVar104._16_4_ + fVar215;
    auVar192._20_4_ = auVar104._20_4_ + fVar216;
    auVar192._24_4_ = auVar104._24_4_ + fVar204;
    auVar192._28_4_ = auVar104._28_4_ + auVar94._28_4_;
    auVar105 = vpermt2ps_avx512vl(auVar105,_DAT_01fb9fc0,ZEXT1632(auVar71));
    auVar94 = vaddps_avx512vl(auVar97,auVar89);
    auVar89 = vpermt2ps_avx512vl(auVar89,_DAT_01fb9fc0,ZEXT1632(auVar71));
    auVar105 = vsubps_avx(auVar95,auVar105);
    auVar89 = vsubps_avx512vl(auVar96,auVar89);
    auVar109 = ZEXT1632(auVar75);
    auVar91 = vsubps_avx512vl(auVar104,auVar109);
    auVar111 = ZEXT1632(auVar87);
    auVar98 = vsubps_avx512vl(auVar97,auVar111);
    auVar99 = vsubps_avx512vl(auVar95,auVar88);
    auVar91 = vaddps_avx512vl(auVar91,auVar99);
    auVar99 = vsubps_avx512vl(auVar96,auVar90);
    auVar98 = vaddps_avx512vl(auVar98,auVar99);
    auVar99 = vmulps_avx512vl(auVar111,auVar91);
    auVar99 = vfnmadd231ps_avx512vl(auVar99,auVar109,auVar98);
    auVar100 = vmulps_avx512vl(auVar92,auVar91);
    auVar100 = vfnmadd231ps_avx512vl(auVar100,auVar131,auVar98);
    auVar101 = vmulps_avx512vl(auVar93,auVar91);
    auVar101 = vfnmadd231ps_avx512vl(auVar101,auVar103,auVar98);
    auVar102 = vmulps_avx512vl(auVar90,auVar91);
    auVar102 = vfnmadd231ps_avx512vl(auVar102,auVar88,auVar98);
    auVar106 = vmulps_avx512vl(auVar97,auVar91);
    auVar106 = vfnmadd231ps_avx512vl(auVar106,auVar104,auVar98);
    auVar107 = vmulps_avx512vl(auVar94,auVar91);
    auVar107 = vfnmadd231ps_avx512vl(auVar107,auVar192,auVar98);
    auVar108 = vmulps_avx512vl(auVar89,auVar91);
    auVar108 = vfnmadd231ps_avx512vl(auVar108,auVar105,auVar98);
    auVar91 = vmulps_avx512vl(auVar96,auVar91);
    auVar91 = vfnmadd231ps_avx512vl(auVar91,auVar95,auVar98);
    auVar98 = vminps_avx512vl(auVar99,auVar100);
    auVar99 = vmaxps_avx512vl(auVar99,auVar100);
    auVar100 = vminps_avx512vl(auVar101,auVar102);
    auVar98 = vminps_avx512vl(auVar98,auVar100);
    auVar100 = vmaxps_avx512vl(auVar101,auVar102);
    auVar99 = vmaxps_avx512vl(auVar99,auVar100);
    auVar100 = vminps_avx512vl(auVar106,auVar107);
    auVar101 = vmaxps_avx512vl(auVar106,auVar107);
    auVar102 = vminps_avx512vl(auVar108,auVar91);
    auVar100 = vminps_avx512vl(auVar100,auVar102);
    auVar98 = vminps_avx512vl(auVar98,auVar100);
    auVar91 = vmaxps_avx512vl(auVar108,auVar91);
    auVar91 = vmaxps_avx512vl(auVar101,auVar91);
    auVar99 = vmaxps_avx512vl(auVar99,auVar91);
    uVar12 = vcmpps_avx512vl(auVar98,local_78,2);
    auVar91._4_4_ = uStack_94;
    auVar91._0_4_ = local_98;
    auVar91._8_4_ = uStack_90;
    auVar91._12_4_ = uStack_8c;
    auVar91._16_4_ = uStack_88;
    auVar91._20_4_ = uStack_84;
    auVar91._24_4_ = uStack_80;
    auVar91._28_4_ = uStack_7c;
    uVar13 = vcmpps_avx512vl(auVar99,auVar91,5);
    bVar24 = (byte)uVar12 & (byte)uVar13 & 0x7f;
    if (bVar24 == 0) {
      auVar53 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
      auVar237 = ZEXT1664(auVar53);
      auVar105 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
      auVar238 = ZEXT3264(auVar105);
      auVar53 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
      auVar239 = ZEXT1664(auVar53);
      auVar240 = ZEXT3264(_DAT_01fb9fe0);
    }
    else {
      auVar98 = vsubps_avx512vl(auVar88,auVar109);
      auVar99 = vsubps_avx512vl(auVar90,auVar111);
      auVar100 = vsubps_avx512vl(auVar95,auVar104);
      auVar98 = vaddps_avx512vl(auVar98,auVar100);
      auVar100 = vsubps_avx512vl(auVar96,auVar97);
      auVar99 = vaddps_avx512vl(auVar99,auVar100);
      auVar100 = vmulps_avx512vl(auVar111,auVar98);
      auVar100 = vfnmadd231ps_avx512vl(auVar100,auVar99,auVar109);
      auVar92 = vmulps_avx512vl(auVar92,auVar98);
      auVar92 = vfnmadd213ps_avx512vl(auVar131,auVar99,auVar92);
      auVar93 = vmulps_avx512vl(auVar93,auVar98);
      auVar93 = vfnmadd213ps_avx512vl(auVar103,auVar99,auVar93);
      auVar103 = vmulps_avx512vl(auVar90,auVar98);
      auVar90 = vfnmadd231ps_avx512vl(auVar103,auVar99,auVar88);
      auVar103 = vmulps_avx512vl(auVar97,auVar98);
      auVar97 = vfnmadd231ps_avx512vl(auVar103,auVar99,auVar104);
      auVar103 = vmulps_avx512vl(auVar94,auVar98);
      auVar94 = vfnmadd213ps_avx512vl(auVar192,auVar99,auVar103);
      auVar103 = vmulps_avx512vl(auVar89,auVar98);
      auVar101 = vfnmadd213ps_avx512vl(auVar105,auVar99,auVar103);
      auVar105 = vmulps_avx512vl(auVar96,auVar98);
      auVar95 = vfnmadd231ps_avx512vl(auVar105,auVar95,auVar99);
      auVar103 = vminps_avx(auVar100,auVar92);
      auVar105 = vmaxps_avx(auVar100,auVar92);
      auVar88 = vminps_avx(auVar93,auVar90);
      auVar88 = vminps_avx(auVar103,auVar88);
      auVar103 = vmaxps_avx(auVar93,auVar90);
      auVar105 = vmaxps_avx(auVar105,auVar103);
      auVar104 = vminps_avx(auVar97,auVar94);
      auVar103 = vmaxps_avx(auVar97,auVar94);
      auVar89 = vminps_avx(auVar101,auVar95);
      auVar104 = vminps_avx(auVar104,auVar89);
      auVar104 = vminps_avx(auVar88,auVar104);
      auVar88 = vmaxps_avx(auVar101,auVar95);
      auVar103 = vmaxps_avx(auVar103,auVar88);
      auVar105 = vmaxps_avx(auVar105,auVar103);
      uVar12 = vcmpps_avx512vl(auVar105,auVar91,5);
      uVar13 = vcmpps_avx512vl(auVar104,local_78,2);
      bVar24 = bVar24 & (byte)uVar12 & (byte)uVar13;
      if (bVar24 != 0) {
        mask_stack[uVar26] = (uint)bVar24;
        BVar1 = (BBox1f)vmovlps_avx(auVar53);
        cu_stack[uVar26] = BVar1;
        BVar1 = (BBox1f)vmovlps_avx(auVar83);
        cv_stack[uVar26] = BVar1;
        uVar26 = (ulong)((int)uVar26 + 1);
      }
      auVar53 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
      auVar237 = ZEXT1664(auVar53);
      auVar105 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
      auVar238 = ZEXT3264(auVar105);
      auVar53 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
      auVar239 = ZEXT1664(auVar53);
      auVar240 = ZEXT3264(_DAT_01fb9fe0);
    }
LAB_01811d81:
    do {
      do {
        do {
          auVar74 = auVar242._0_16_;
          auVar80 = SUB6416(ZEXT464(0xb8d1b717),0);
          if ((int)uVar26 == 0) {
            uVar126 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar19._4_4_ = uVar126;
            auVar19._0_4_ = uVar126;
            auVar19._8_4_ = uVar126;
            auVar19._12_4_ = uVar126;
            uVar12 = vcmpps_avx512vl(auVar43,auVar19,2);
            uVar30 = (ulong)((uint)uVar30 & (uint)uVar12);
            goto LAB_018110cb;
          }
          uVar25 = (int)uVar26 - 1;
          uVar6 = mask_stack[uVar25];
          auVar83._8_8_ = 0;
          auVar83._0_4_ = cv_stack[uVar25].lower;
          auVar83._4_4_ = cv_stack[uVar25].upper;
          uVar31 = 0;
          for (uVar29 = (ulong)uVar6; (uVar29 & 1) == 0; uVar29 = uVar29 >> 1 | 0x8000000000000000)
          {
            uVar31 = uVar31 + 1;
          }
          uVar28 = uVar6 - 1 & uVar6;
          bVar34 = uVar28 == 0;
          mask_stack[uVar25] = uVar28;
          if (bVar34) {
            uVar26 = (ulong)uVar25;
          }
          auVar121._8_8_ = 0;
          auVar121._0_8_ = uVar31;
          auVar53 = vpunpcklqdq_avx(auVar121,ZEXT416((int)uVar31 + 1));
          auVar53 = vcvtqq2ps_avx512vl(auVar53);
          auVar53 = vmulps_avx512vl(auVar53,auVar239._0_16_);
          fVar204 = cu_stack[uVar25].upper;
          auVar14._4_4_ = fVar204;
          auVar14._0_4_ = fVar204;
          auVar14._8_4_ = fVar204;
          auVar14._12_4_ = fVar204;
          auVar71 = vmulps_avx512vl(auVar53,auVar14);
          auVar53 = vsubps_avx512vl(auVar74,auVar53);
          fVar204 = cu_stack[uVar25].lower;
          auVar15._4_4_ = fVar204;
          auVar15._0_4_ = fVar204;
          auVar15._8_4_ = fVar204;
          auVar15._12_4_ = fVar204;
          auVar53 = vfmadd231ps_avx512vl(auVar71,auVar53,auVar15);
          auVar71 = vmovshdup_avx(auVar53);
          fVar204 = auVar71._0_4_ - auVar53._0_4_;
          vucomiss_avx512f(ZEXT416((uint)fVar204));
          if (uVar6 == 0 || bVar34) goto LAB_01811815;
          auVar71 = vshufps_avx(auVar83,auVar83,0x50);
          vucomiss_avx512f(ZEXT416((uint)fVar204));
          bVar32 = (uint)uVar26 < 4;
          uVar25 = (uint)uVar26 - 4;
          bVar35 = uVar25 == 0;
          bVar33 = (POPCOUNT(uVar25 & 0xff) & 1U) == 0;
          auVar75 = vsubps_avx512vl(auVar74,auVar71);
          fVar193 = auVar71._0_4_;
          auVar149._0_4_ = fVar193 * fVar132;
          fVar202 = auVar71._4_4_;
          auVar149._4_4_ = fVar202 * fVar133;
          fVar203 = auVar71._8_4_;
          auVar149._8_4_ = fVar203 * fVar132;
          fVar214 = auVar71._12_4_;
          auVar149._12_4_ = fVar214 * fVar133;
          auVar157._0_4_ = fVar193 * fVar134;
          auVar157._4_4_ = fVar202 * fVar142;
          auVar157._8_4_ = fVar203 * fVar134;
          auVar157._12_4_ = fVar214 * fVar142;
          auVar161._0_4_ = fVar193 * fVar145;
          auVar161._4_4_ = fVar202 * fVar146;
          auVar161._8_4_ = fVar203 * fVar145;
          auVar161._12_4_ = fVar214 * fVar146;
          auVar137._0_4_ = fVar193 * fVar147;
          auVar137._4_4_ = fVar202 * fVar205;
          auVar137._8_4_ = fVar203 * fVar147;
          auVar137._12_4_ = fVar214 * fVar205;
          auVar71 = vfmadd231ps_fma(auVar149,auVar75,auVar45);
          auVar72 = vfmadd231ps_fma(auVar157,auVar75,auVar47);
          auVar73 = vfmadd231ps_fma(auVar161,auVar75,auVar48);
          auVar75 = vfmadd231ps_fma(auVar137,auVar75,auVar49);
          auVar96._16_16_ = auVar71;
          auVar96._0_16_ = auVar71;
          auVar97._16_16_ = auVar72;
          auVar97._0_16_ = auVar72;
          auVar99._16_16_ = auVar73;
          auVar99._0_16_ = auVar73;
          auVar103 = vpermps_avx512vl(auVar240._0_32_,ZEXT1632(auVar53));
          auVar105 = vsubps_avx(auVar97,auVar96);
          auVar72 = vfmadd213ps_fma(auVar105,auVar103,auVar96);
          auVar105 = vsubps_avx(auVar99,auVar97);
          auVar87 = vfmadd213ps_fma(auVar105,auVar103,auVar97);
          auVar71 = vsubps_avx(auVar75,auVar73);
          auVar98._16_16_ = auVar71;
          auVar98._0_16_ = auVar71;
          auVar71 = vfmadd213ps_fma(auVar98,auVar103,auVar99);
          auVar105 = vsubps_avx(ZEXT1632(auVar87),ZEXT1632(auVar72));
          auVar72 = vfmadd213ps_fma(auVar105,auVar103,ZEXT1632(auVar72));
          auVar105 = vsubps_avx(ZEXT1632(auVar71),ZEXT1632(auVar87));
          auVar71 = vfmadd213ps_fma(auVar105,auVar103,ZEXT1632(auVar87));
          auVar105 = vsubps_avx(ZEXT1632(auVar71),ZEXT1632(auVar72));
          auVar155 = vfmadd231ps_fma(ZEXT1632(auVar72),auVar105,auVar103);
          auVar105 = vmulps_avx512vl(auVar105,auVar238._0_32_);
          auVar95._16_16_ = auVar105._16_16_;
          auVar71 = vmulss_avx512f(ZEXT416((uint)fVar204),SUB6416(ZEXT464(0x3eaaaaab),0));
          fVar193 = auVar71._0_4_;
          auVar162._0_8_ =
               CONCAT44(auVar155._4_4_ + fVar193 * auVar105._4_4_,
                        auVar155._0_4_ + fVar193 * auVar105._0_4_);
          auVar162._8_4_ = auVar155._8_4_ + fVar193 * auVar105._8_4_;
          auVar162._12_4_ = auVar155._12_4_ + fVar193 * auVar105._12_4_;
          auVar150._0_4_ = fVar193 * auVar105._16_4_;
          auVar150._4_4_ = fVar193 * auVar105._20_4_;
          auVar150._8_4_ = fVar193 * auVar105._24_4_;
          auVar150._12_4_ = fVar193 * auVar105._28_4_;
          auVar82 = vsubps_avx((undefined1  [16])0x0,auVar150);
          auVar87 = vshufpd_avx(auVar155,auVar155,3);
          auVar84 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
          auVar71 = vsubps_avx(auVar87,auVar155);
          auVar72 = vsubps_avx(auVar84,(undefined1  [16])0x0);
          auVar178._0_4_ = auVar71._0_4_ + auVar72._0_4_;
          auVar178._4_4_ = auVar71._4_4_ + auVar72._4_4_;
          auVar178._8_4_ = auVar71._8_4_ + auVar72._8_4_;
          auVar178._12_4_ = auVar71._12_4_ + auVar72._12_4_;
          auVar71 = vshufps_avx(auVar155,auVar155,0xb1);
          auVar72 = vshufps_avx(auVar162,auVar162,0xb1);
          auVar73 = vshufps_avx(auVar82,auVar82,0xb1);
          auVar75 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
          auVar230._4_4_ = auVar178._0_4_;
          auVar230._0_4_ = auVar178._0_4_;
          auVar230._8_4_ = auVar178._0_4_;
          auVar230._12_4_ = auVar178._0_4_;
          auVar78 = vshufps_avx(auVar178,auVar178,0x55);
          fVar193 = auVar78._0_4_;
          auVar188._0_4_ = auVar71._0_4_ * fVar193;
          fVar202 = auVar78._4_4_;
          auVar188._4_4_ = auVar71._4_4_ * fVar202;
          fVar203 = auVar78._8_4_;
          auVar188._8_4_ = auVar71._8_4_ * fVar203;
          fVar214 = auVar78._12_4_;
          auVar188._12_4_ = auVar71._12_4_ * fVar214;
          auVar195._0_4_ = auVar72._0_4_ * fVar193;
          auVar195._4_4_ = auVar72._4_4_ * fVar202;
          auVar195._8_4_ = auVar72._8_4_ * fVar203;
          auVar195._12_4_ = auVar72._12_4_ * fVar214;
          auVar207._0_4_ = auVar73._0_4_ * fVar193;
          auVar207._4_4_ = auVar73._4_4_ * fVar202;
          auVar207._8_4_ = auVar73._8_4_ * fVar203;
          auVar207._12_4_ = auVar73._12_4_ * fVar214;
          auVar179._0_4_ = auVar75._0_4_ * fVar193;
          auVar179._4_4_ = auVar75._4_4_ * fVar202;
          auVar179._8_4_ = auVar75._8_4_ * fVar203;
          auVar179._12_4_ = auVar75._12_4_ * fVar214;
          auVar71 = vfmadd231ps_fma(auVar188,auVar230,auVar155);
          auVar72 = vfmadd231ps_fma(auVar195,auVar230,auVar162);
          auVar81 = vfmadd231ps_fma(auVar207,auVar230,auVar82);
          auVar154 = vfmadd231ps_fma(auVar179,(undefined1  [16])0x0,auVar230);
          auVar78 = vshufpd_avx(auVar71,auVar71,1);
          auVar79 = vshufpd_avx(auVar72,auVar72,1);
          auVar76 = vshufpd_avx512vl(auVar81,auVar81,1);
          auVar77 = vshufpd_avx512vl(auVar154,auVar154,1);
          auVar73 = vminss_avx(auVar71,auVar72);
          auVar71 = vmaxss_avx(auVar72,auVar71);
          auVar75 = vminss_avx(auVar81,auVar154);
          auVar72 = vmaxss_avx(auVar154,auVar81);
          auVar73 = vminss_avx(auVar73,auVar75);
          auVar71 = vmaxss_avx(auVar72,auVar71);
          auVar75 = vminss_avx(auVar78,auVar79);
          auVar72 = vmaxss_avx(auVar79,auVar78);
          auVar78 = vminss_avx512f(auVar76,auVar77);
          auVar79 = vmaxss_avx512f(auVar77,auVar76);
          vmaxss_avx(auVar79,auVar72);
          auVar72 = vminss_avx512f(auVar75,auVar78);
          vucomiss_avx512f(auVar73);
          if ((!bVar32 && !bVar35) &&
             (auVar75 = vucomiss_avx512f(auVar80), bVar36 = bVar35, !bVar32 && !bVar35)) break;
          auVar75 = vucomiss_avx512f(auVar80);
          auVar78 = vucomiss_avx512f(auVar72);
          auVar71 = vucomiss_avx512f(auVar80);
          bVar36 = bVar32 || bVar35;
          bVar33 = bVar32 || bVar35;
          if (!bVar32 && !bVar35) break;
          uVar12 = vcmpps_avx512vl(auVar73,auVar78,5);
          uVar13 = vcmpps_avx512vl(auVar72,auVar78,5);
          uVar25 = (uint)uVar12 & (uint)uVar13;
          bVar20 = (uVar25 & 1) == 0;
          bVar36 = (!bVar32 && !bVar35) && bVar20;
          bVar33 = (!bVar32 && !bVar35) && (uVar25 & 1) == 0;
        } while ((bVar32 || bVar35) || !bVar20);
        auVar79 = auVar243._0_16_;
        vcmpss_avx512f(auVar73,auVar79,1);
        uVar12 = vcmpss_avx512f(auVar71,auVar79,1);
        bVar35 = (bool)((byte)uVar12 & 1);
        auVar95._0_16_ = auVar244._0_16_;
        auVar109._4_28_ = auVar95._4_28_;
        auVar109._0_4_ = (float)((uint)bVar35 * -0x40800000 + (uint)!bVar35 * auVar244._0_4_);
        vucomiss_avx512f(auVar109._0_16_);
        bVar33 = (bool)(!bVar36 | bVar33);
        bVar36 = bVar33 == false;
        auVar111._16_16_ = auVar95._16_16_;
        auVar111._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
        auVar110._4_28_ = auVar111._4_28_;
        auVar110._0_4_ = (uint)bVar33 * auVar243._0_4_ + (uint)!bVar33 * 0x7f800000;
        auVar78 = auVar110._0_16_;
        auVar113._16_16_ = auVar95._16_16_;
        auVar113._0_16_ = SUB6416(ZEXT464(0xff800000),0);
        auVar112._4_28_ = auVar113._4_28_;
        auVar112._0_4_ = (uint)bVar33 * auVar243._0_4_ + (uint)!bVar33 * -0x800000;
        auVar80 = auVar112._0_16_;
        uVar12 = vcmpss_avx512f(auVar72,auVar79,1);
        bVar35 = (bool)((byte)uVar12 & 1);
        auVar115._16_16_ = auVar95._16_16_;
        auVar115._0_16_ = auVar244._0_16_;
        auVar114._4_28_ = auVar115._4_28_;
        auVar114._0_4_ = (float)((uint)bVar35 * -0x40800000 + (uint)!bVar35 * auVar244._0_4_);
        vucomiss_avx512f(auVar114._0_16_);
        if ((bVar33) || (bVar36)) {
          auVar72 = vucomiss_avx512f(auVar73);
          if ((bVar33) || (bVar36)) {
            auVar18._8_4_ = 0x80000000;
            auVar18._0_8_ = 0x8000000080000000;
            auVar18._12_4_ = 0x80000000;
            auVar81 = vxorps_avx512vl(auVar73,auVar18);
            auVar72 = vsubss_avx512f(auVar72,auVar73);
            auVar72 = vdivss_avx512f(auVar81,auVar72);
            auVar73 = vsubss_avx512f(ZEXT416(0x3f800000),auVar72);
            auVar73 = vfmadd213ss_avx512f(auVar73,auVar79,auVar72);
            auVar72 = auVar73;
          }
          else {
            auVar72 = vxorps_avx512vl(auVar72,auVar72);
            vucomiss_avx512f(auVar72);
            auVar73 = ZEXT416(0x3f800000);
            if ((bVar33) || (bVar36)) {
              auVar73 = SUB6416(ZEXT464(0xff800000),0);
              auVar72 = SUB6416(ZEXT464(0x7f800000),0);
            }
          }
          auVar78 = vminss_avx512f(auVar78,auVar72);
          auVar80 = vmaxss_avx(auVar73,auVar80);
        }
        auVar244 = ZEXT464(0x3f800000);
        uVar12 = vcmpss_avx512f(auVar75,auVar79,1);
        bVar33 = (bool)((byte)uVar12 & 1);
        auVar72 = auVar244._0_16_;
        fVar193 = (float)((uint)bVar33 * -0x40800000 + (uint)!bVar33 * 0x3f800000);
        if ((auVar109._0_4_ != fVar193) || (NAN(auVar109._0_4_) || NAN(fVar193))) {
          fVar203 = auVar75._0_4_;
          fVar202 = auVar71._0_4_;
          if ((fVar203 != fVar202) || (NAN(fVar203) || NAN(fVar202))) {
            auVar17._8_4_ = 0x80000000;
            auVar17._0_8_ = 0x8000000080000000;
            auVar17._12_4_ = 0x80000000;
            auVar71 = vxorps_avx512vl(auVar71,auVar17);
            auVar180._0_4_ = auVar71._0_4_ / (fVar203 - fVar202);
            auVar180._4_12_ = auVar71._4_12_;
            auVar71 = vsubss_avx512f(auVar72,auVar180);
            auVar71 = vfmadd213ss_avx512f(auVar71,auVar79,auVar180);
            auVar73 = auVar71;
          }
          else if ((fVar202 != 0.0) ||
                  (auVar71 = auVar72, auVar73 = ZEXT816(0) << 0x40, NAN(fVar202))) {
            auVar71 = SUB6416(ZEXT464(0xff800000),0);
            auVar73 = SUB6416(ZEXT464(0x7f800000),0);
          }
          auVar78 = vminss_avx(auVar78,auVar73);
          auVar80 = vmaxss_avx(auVar71,auVar80);
        }
        bVar33 = auVar114._0_4_ != fVar193;
        auVar71 = vminss_avx512f(auVar78,auVar72);
        auVar117._16_16_ = auVar95._16_16_;
        auVar117._0_16_ = auVar78;
        auVar116._4_28_ = auVar117._4_28_;
        auVar116._0_4_ = (uint)bVar33 * auVar71._0_4_ + (uint)!bVar33 * auVar78._0_4_;
        auVar71 = vmaxss_avx512f(auVar72,auVar80);
        auVar119._16_16_ = auVar95._16_16_;
        auVar119._0_16_ = auVar80;
        auVar118._4_28_ = auVar119._4_28_;
        auVar118._0_4_ = (uint)bVar33 * auVar71._0_4_ + (uint)!bVar33 * auVar80._0_4_;
        auVar80 = vmaxss_avx512f(auVar79,auVar116._0_16_);
        auVar71 = vminss_avx512f(auVar118._0_16_,auVar72);
      } while (auVar71._0_4_ < auVar80._0_4_);
      auVar79 = vmaxss_avx512f(auVar79,ZEXT416((uint)(auVar80._0_4_ + -0.1)));
      auVar81 = vminss_avx512f(ZEXT416((uint)(auVar71._0_4_ + 0.1)),auVar72);
      auVar138._0_8_ = auVar155._0_8_;
      auVar138._8_8_ = auVar138._0_8_;
      auVar196._8_8_ = auVar162._0_8_;
      auVar196._0_8_ = auVar162._0_8_;
      auVar208._8_8_ = auVar82._0_8_;
      auVar208._0_8_ = auVar82._0_8_;
      auVar80 = vshufpd_avx(auVar162,auVar162,3);
      auVar71 = vshufpd_avx(auVar82,auVar82,3);
      auVar73 = vshufps_avx(auVar79,auVar81,0);
      auVar78 = vsubps_avx512vl(auVar74,auVar73);
      fVar193 = auVar73._0_4_;
      auVar158._0_4_ = fVar193 * auVar87._0_4_;
      fVar202 = auVar73._4_4_;
      auVar158._4_4_ = fVar202 * auVar87._4_4_;
      fVar203 = auVar73._8_4_;
      auVar158._8_4_ = fVar203 * auVar87._8_4_;
      fVar214 = auVar73._12_4_;
      auVar158._12_4_ = fVar214 * auVar87._12_4_;
      auVar163._0_4_ = fVar193 * auVar80._0_4_;
      auVar163._4_4_ = fVar202 * auVar80._4_4_;
      auVar163._8_4_ = fVar203 * auVar80._8_4_;
      auVar163._12_4_ = fVar214 * auVar80._12_4_;
      auVar233._0_4_ = auVar71._0_4_ * fVar193;
      auVar233._4_4_ = auVar71._4_4_ * fVar202;
      auVar233._8_4_ = auVar71._8_4_ * fVar203;
      auVar233._12_4_ = auVar71._12_4_ * fVar214;
      auVar151._0_4_ = fVar193 * auVar84._0_4_;
      auVar151._4_4_ = fVar202 * auVar84._4_4_;
      auVar151._8_4_ = fVar203 * auVar84._8_4_;
      auVar151._12_4_ = fVar214 * auVar84._12_4_;
      auVar75 = vfmadd231ps_fma(auVar158,auVar78,auVar138);
      auVar87 = vfmadd231ps_fma(auVar163,auVar78,auVar196);
      auVar84 = vfmadd231ps_fma(auVar233,auVar78,auVar208);
      auVar78 = vfmadd231ps_fma(auVar151,auVar78,ZEXT816(0));
      auVar71 = vsubss_avx512f(auVar72,auVar79);
      auVar80 = vmovshdup_avx(auVar83);
      auVar154 = vfmadd231ss_fma(ZEXT416((uint)(auVar80._0_4_ * auVar79._0_4_)),auVar83,auVar71);
      auVar71 = vsubss_avx512f(auVar72,auVar81);
      auVar155 = vfmadd231ss_fma(ZEXT416((uint)(auVar80._0_4_ * auVar81._0_4_)),auVar83,auVar71);
      auVar79 = vdivss_avx512f(auVar72,ZEXT416((uint)fVar204));
      auVar83 = vsubps_avx(auVar87,auVar75);
      auVar82 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
      auVar71 = vmulps_avx512vl(auVar83,auVar82);
      auVar83 = vsubps_avx(auVar84,auVar87);
      auVar73 = vmulps_avx512vl(auVar83,auVar82);
      auVar83 = vsubps_avx(auVar78,auVar84);
      auVar83 = vmulps_avx512vl(auVar83,auVar82);
      auVar80 = vminps_avx(auVar73,auVar83);
      auVar83 = vmaxps_avx(auVar73,auVar83);
      auVar80 = vminps_avx(auVar71,auVar80);
      auVar83 = vmaxps_avx(auVar71,auVar83);
      auVar71 = vshufpd_avx(auVar80,auVar80,3);
      auVar73 = vshufpd_avx(auVar83,auVar83,3);
      auVar80 = vminps_avx(auVar80,auVar71);
      auVar83 = vmaxps_avx(auVar83,auVar73);
      fVar204 = auVar79._0_4_;
      auVar181._0_4_ = auVar80._0_4_ * fVar204;
      auVar181._4_4_ = auVar80._4_4_ * fVar204;
      auVar181._8_4_ = auVar80._8_4_ * fVar204;
      auVar181._12_4_ = auVar80._12_4_ * fVar204;
      auVar170._0_4_ = fVar204 * auVar83._0_4_;
      auVar170._4_4_ = fVar204 * auVar83._4_4_;
      auVar170._8_4_ = fVar204 * auVar83._8_4_;
      auVar170._12_4_ = fVar204 * auVar83._12_4_;
      auVar79 = vdivss_avx512f(auVar72,ZEXT416((uint)(auVar155._0_4_ - auVar154._0_4_)));
      auVar83 = vshufpd_avx(auVar75,auVar75,3);
      auVar80 = vshufpd_avx(auVar87,auVar87,3);
      auVar71 = vshufpd_avx(auVar84,auVar84,3);
      auVar73 = vshufpd_avx(auVar78,auVar78,3);
      auVar83 = vsubps_avx(auVar83,auVar75);
      auVar75 = vsubps_avx(auVar80,auVar87);
      auVar87 = vsubps_avx(auVar71,auVar84);
      auVar73 = vsubps_avx(auVar73,auVar78);
      auVar80 = vminps_avx(auVar83,auVar75);
      auVar83 = vmaxps_avx(auVar83,auVar75);
      auVar71 = vminps_avx(auVar87,auVar73);
      auVar71 = vminps_avx(auVar80,auVar71);
      auVar80 = vmaxps_avx(auVar87,auVar73);
      auVar83 = vmaxps_avx(auVar83,auVar80);
      fVar204 = auVar79._0_4_;
      auVar209._0_4_ = fVar204 * auVar71._0_4_;
      auVar209._4_4_ = fVar204 * auVar71._4_4_;
      auVar209._8_4_ = fVar204 * auVar71._8_4_;
      auVar209._12_4_ = fVar204 * auVar71._12_4_;
      auVar197._0_4_ = fVar204 * auVar83._0_4_;
      auVar197._4_4_ = fVar204 * auVar83._4_4_;
      auVar197._8_4_ = fVar204 * auVar83._8_4_;
      auVar197._12_4_ = fVar204 * auVar83._12_4_;
      auVar73 = vinsertps_avx(auVar53,auVar154,0x10);
      auVar76 = vpermt2ps_avx512vl(auVar53,_DAT_01fb9f90,auVar155);
      auVar127._0_4_ = auVar73._0_4_ + auVar76._0_4_;
      auVar127._4_4_ = auVar73._4_4_ + auVar76._4_4_;
      auVar127._8_4_ = auVar73._8_4_ + auVar76._8_4_;
      auVar127._12_4_ = auVar73._12_4_ + auVar76._12_4_;
      auVar79 = vmulps_avx512vl(auVar127,auVar237._0_16_);
      auVar80 = vshufps_avx(auVar79,auVar79,0x54);
      uVar126 = auVar79._0_4_;
      auVar130._4_4_ = uVar126;
      auVar130._0_4_ = uVar126;
      auVar130._8_4_ = uVar126;
      auVar130._12_4_ = uVar126;
      auVar71 = vfmadd213ps_fma(auVar41,auVar130,auVar11);
      auVar75 = vfmadd213ps_fma(auVar64,auVar130,auVar38);
      auVar87 = vfmadd213ps_fma(auVar65,auVar130,auVar46);
      auVar83 = vsubps_avx(auVar75,auVar71);
      auVar71 = vfmadd213ps_fma(auVar83,auVar130,auVar71);
      auVar83 = vsubps_avx(auVar87,auVar75);
      auVar83 = vfmadd213ps_fma(auVar83,auVar130,auVar75);
      auVar83 = vsubps_avx(auVar83,auVar71);
      auVar71 = vfmadd231ps_fma(auVar71,auVar83,auVar130);
      auVar84 = vmulps_avx512vl(auVar83,auVar82);
      auVar220._8_8_ = auVar71._0_8_;
      auVar220._0_8_ = auVar71._0_8_;
      auVar83 = vshufpd_avx(auVar71,auVar71,3);
      auVar71 = vshufps_avx(auVar79,auVar79,0x55);
      auVar75 = vsubps_avx(auVar83,auVar220);
      auVar87 = vfmadd231ps_fma(auVar220,auVar71,auVar75);
      auVar234._8_8_ = auVar84._0_8_;
      auVar234._0_8_ = auVar84._0_8_;
      auVar83 = vshufpd_avx(auVar84,auVar84,3);
      auVar83 = vsubps_avx512vl(auVar83,auVar234);
      auVar83 = vfmadd213ps_avx512vl(auVar83,auVar71,auVar234);
      auVar71 = vxorps_avx512vl(auVar75,auVar245._0_16_);
      auVar84 = vmovshdup_avx512vl(auVar83);
      auVar78 = vxorps_avx512vl(auVar84,auVar245._0_16_);
      auVar82 = vmovshdup_avx512vl(auVar75);
      auVar78 = vpermt2ps_avx512vl(auVar78,ZEXT416(5),auVar75);
      auVar77 = vxorps_avx512vl(ZEXT416(5),ZEXT416(5));
      auVar243 = ZEXT1664(auVar77);
      auVar75 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar84._0_4_ * auVar75._0_4_)),auVar83,auVar82);
      auVar71 = vpermt2ps_avx512vl(auVar83,SUB6416(ZEXT464(4),0),auVar71);
      auVar152._0_4_ = auVar75._0_4_;
      auVar152._4_4_ = auVar152._0_4_;
      auVar152._8_4_ = auVar152._0_4_;
      auVar152._12_4_ = auVar152._0_4_;
      auVar83 = vdivps_avx(auVar78,auVar152);
      auVar85 = vdivps_avx512vl(auVar71,auVar152);
      fVar204 = auVar87._0_4_;
      auVar71 = vshufps_avx(auVar87,auVar87,0x55);
      auVar221._0_4_ = fVar204 * auVar83._0_4_ + auVar71._0_4_ * auVar85._0_4_;
      auVar221._4_4_ = fVar204 * auVar83._4_4_ + auVar71._4_4_ * auVar85._4_4_;
      auVar221._8_4_ = fVar204 * auVar83._8_4_ + auVar71._8_4_ * auVar85._8_4_;
      auVar221._12_4_ = fVar204 * auVar83._12_4_ + auVar71._12_4_ * auVar85._12_4_;
      auVar82 = vsubps_avx(auVar80,auVar221);
      auVar71 = vmovshdup_avx(auVar83);
      auVar80 = vinsertps_avx(auVar181,auVar209,0x1c);
      auVar235._0_4_ = auVar71._0_4_ * auVar80._0_4_;
      auVar235._4_4_ = auVar71._4_4_ * auVar80._4_4_;
      auVar235._8_4_ = auVar71._8_4_ * auVar80._8_4_;
      auVar235._12_4_ = auVar71._12_4_ * auVar80._12_4_;
      auVar81 = vinsertps_avx512f(auVar170,auVar197,0x1c);
      auVar71 = vmulps_avx512vl(auVar71,auVar81);
      auVar78 = vminps_avx512vl(auVar235,auVar71);
      auVar87 = vmaxps_avx(auVar71,auVar235);
      auVar84 = vmovshdup_avx(auVar85);
      auVar71 = vinsertps_avx(auVar209,auVar181,0x4c);
      auVar210._0_4_ = auVar84._0_4_ * auVar71._0_4_;
      auVar210._4_4_ = auVar84._4_4_ * auVar71._4_4_;
      auVar210._8_4_ = auVar84._8_4_ * auVar71._8_4_;
      auVar210._12_4_ = auVar84._12_4_ * auVar71._12_4_;
      auVar75 = vinsertps_avx(auVar197,auVar170,0x4c);
      auVar198._0_4_ = auVar84._0_4_ * auVar75._0_4_;
      auVar198._4_4_ = auVar84._4_4_ * auVar75._4_4_;
      auVar198._8_4_ = auVar84._8_4_ * auVar75._8_4_;
      auVar198._12_4_ = auVar84._12_4_ * auVar75._12_4_;
      auVar84 = vminps_avx(auVar210,auVar198);
      auVar78 = vaddps_avx512vl(auVar78,auVar84);
      auVar84 = vmaxps_avx(auVar198,auVar210);
      auVar199._0_4_ = auVar87._0_4_ + auVar84._0_4_;
      auVar199._4_4_ = auVar87._4_4_ + auVar84._4_4_;
      auVar199._8_4_ = auVar87._8_4_ + auVar84._8_4_;
      auVar199._12_4_ = auVar87._12_4_ + auVar84._12_4_;
      auVar211._8_8_ = 0x3f80000000000000;
      auVar211._0_8_ = 0x3f80000000000000;
      auVar87 = vsubps_avx(auVar211,auVar199);
      auVar84 = vsubps_avx(auVar211,auVar78);
      auVar78 = vsubps_avx(auVar73,auVar79);
      auVar79 = vsubps_avx(auVar76,auVar79);
      fVar214 = auVar78._0_4_;
      auVar236._0_4_ = fVar214 * auVar87._0_4_;
      fVar215 = auVar78._4_4_;
      auVar236._4_4_ = fVar215 * auVar87._4_4_;
      fVar216 = auVar78._8_4_;
      auVar236._8_4_ = fVar216 * auVar87._8_4_;
      fVar217 = auVar78._12_4_;
      auVar236._12_4_ = fVar217 * auVar87._12_4_;
      auVar86 = vbroadcastss_avx512vl(auVar83);
      auVar80 = vmulps_avx512vl(auVar86,auVar80);
      auVar81 = vmulps_avx512vl(auVar86,auVar81);
      auVar86 = vminps_avx512vl(auVar80,auVar81);
      auVar81 = vmaxps_avx512vl(auVar81,auVar80);
      auVar80 = vbroadcastss_avx512vl(auVar85);
      auVar71 = vmulps_avx512vl(auVar80,auVar71);
      auVar80 = vmulps_avx512vl(auVar80,auVar75);
      auVar75 = vminps_avx512vl(auVar71,auVar80);
      auVar75 = vaddps_avx512vl(auVar86,auVar75);
      auVar78 = vmulps_avx512vl(auVar78,auVar84);
      fVar204 = auVar79._0_4_;
      auVar200._0_4_ = fVar204 * auVar87._0_4_;
      fVar193 = auVar79._4_4_;
      auVar200._4_4_ = fVar193 * auVar87._4_4_;
      fVar202 = auVar79._8_4_;
      auVar200._8_4_ = fVar202 * auVar87._8_4_;
      fVar203 = auVar79._12_4_;
      auVar200._12_4_ = fVar203 * auVar87._12_4_;
      auVar212._0_4_ = fVar204 * auVar84._0_4_;
      auVar212._4_4_ = fVar193 * auVar84._4_4_;
      auVar212._8_4_ = fVar202 * auVar84._8_4_;
      auVar212._12_4_ = fVar203 * auVar84._12_4_;
      auVar80 = vmaxps_avx(auVar80,auVar71);
      auVar171._0_4_ = auVar81._0_4_ + auVar80._0_4_;
      auVar171._4_4_ = auVar81._4_4_ + auVar80._4_4_;
      auVar171._8_4_ = auVar81._8_4_ + auVar80._8_4_;
      auVar171._12_4_ = auVar81._12_4_ + auVar80._12_4_;
      auVar182._8_8_ = 0x3f800000;
      auVar182._0_8_ = 0x3f800000;
      auVar80 = vsubps_avx(auVar182,auVar171);
      auVar71 = vsubps_avx512vl(auVar182,auVar75);
      auVar231._0_4_ = fVar214 * auVar80._0_4_;
      auVar231._4_4_ = fVar215 * auVar80._4_4_;
      auVar231._8_4_ = fVar216 * auVar80._8_4_;
      auVar231._12_4_ = fVar217 * auVar80._12_4_;
      auVar222._0_4_ = fVar214 * auVar71._0_4_;
      auVar222._4_4_ = fVar215 * auVar71._4_4_;
      auVar222._8_4_ = fVar216 * auVar71._8_4_;
      auVar222._12_4_ = fVar217 * auVar71._12_4_;
      auVar172._0_4_ = fVar204 * auVar80._0_4_;
      auVar172._4_4_ = fVar193 * auVar80._4_4_;
      auVar172._8_4_ = fVar202 * auVar80._8_4_;
      auVar172._12_4_ = fVar203 * auVar80._12_4_;
      auVar183._0_4_ = fVar204 * auVar71._0_4_;
      auVar183._4_4_ = fVar193 * auVar71._4_4_;
      auVar183._8_4_ = fVar202 * auVar71._8_4_;
      auVar183._12_4_ = fVar203 * auVar71._12_4_;
      auVar80 = vminps_avx(auVar231,auVar222);
      auVar71 = vminps_avx512vl(auVar172,auVar183);
      auVar75 = vminps_avx512vl(auVar80,auVar71);
      auVar80 = vmaxps_avx(auVar222,auVar231);
      auVar71 = vmaxps_avx(auVar183,auVar172);
      auVar71 = vmaxps_avx(auVar71,auVar80);
      auVar87 = vminps_avx512vl(auVar236,auVar78);
      auVar80 = vminps_avx(auVar200,auVar212);
      auVar80 = vminps_avx(auVar87,auVar80);
      auVar80 = vhaddps_avx(auVar75,auVar80);
      auVar87 = vmaxps_avx512vl(auVar78,auVar236);
      auVar75 = vmaxps_avx(auVar212,auVar200);
      auVar75 = vmaxps_avx(auVar75,auVar87);
      auVar71 = vhaddps_avx(auVar71,auVar75);
      auVar80 = vshufps_avx(auVar80,auVar80,0xe8);
      auVar71 = vshufps_avx(auVar71,auVar71,0xe8);
      auVar173._0_4_ = auVar80._0_4_ + auVar82._0_4_;
      auVar173._4_4_ = auVar80._4_4_ + auVar82._4_4_;
      auVar173._8_4_ = auVar80._8_4_ + auVar82._8_4_;
      auVar173._12_4_ = auVar80._12_4_ + auVar82._12_4_;
      auVar184._0_4_ = auVar71._0_4_ + auVar82._0_4_;
      auVar184._4_4_ = auVar71._4_4_ + auVar82._4_4_;
      auVar184._8_4_ = auVar71._8_4_ + auVar82._8_4_;
      auVar184._12_4_ = auVar71._12_4_ + auVar82._12_4_;
      auVar80 = vmaxps_avx(auVar73,auVar173);
      auVar71 = vminps_avx(auVar184,auVar76);
      uVar31 = vcmpps_avx512vl(auVar71,auVar80,1);
    } while ((uVar31 & 3) != 0);
    uVar31 = vcmpps_avx512vl(auVar184,auVar76,1);
    uVar12 = vcmpps_avx512vl(auVar53,auVar173,1);
    if (((ushort)uVar12 & (ushort)uVar31 & 1) == 0) {
      bVar24 = 0;
    }
    else {
      auVar80 = vmovshdup_avx(auVar173);
      bVar24 = auVar154._0_4_ < auVar80._0_4_ & (byte)(uVar31 >> 1) & 0x7f;
    }
    p03.field_0.i[0] = auVar44._0_4_;
    p03.field_0.i[1] = auVar44._4_4_;
    p03.field_0.i[2] = auVar44._8_4_;
    p03.field_0.i[3] = auVar44._12_4_;
    if (((!bVar32 || uVar6 != 0 && !bVar34) | bVar24) == 1) {
      lVar27 = 0xc9;
      do {
        lVar27 = lVar27 + -1;
        if (lVar27 == 0) goto LAB_01811d81;
        auVar53 = vsubss_avx512f(auVar72,auVar82);
        fVar202 = auVar53._0_4_;
        fVar204 = fVar202 * fVar202 * fVar202;
        fVar203 = auVar82._0_4_;
        fVar193 = fVar203 * 3.0 * fVar202 * fVar202;
        fVar202 = fVar202 * fVar203 * fVar203 * 3.0;
        auVar144._4_4_ = fVar204;
        auVar144._0_4_ = fVar204;
        auVar144._8_4_ = fVar204;
        auVar144._12_4_ = fVar204;
        auVar139._4_4_ = fVar193;
        auVar139._0_4_ = fVar193;
        auVar139._8_4_ = fVar193;
        auVar139._12_4_ = fVar193;
        auVar122._4_4_ = fVar202;
        auVar122._0_4_ = fVar202;
        auVar122._8_4_ = fVar202;
        auVar122._12_4_ = fVar202;
        fVar203 = fVar203 * fVar203 * fVar203;
        auVar159._0_4_ = p03.field_0.v[0] * fVar203;
        auVar159._4_4_ = p03.field_0.v[1] * fVar203;
        auVar159._8_4_ = p03.field_0.v[2] * fVar203;
        auVar159._12_4_ = p03.field_0.v[3] * fVar203;
        auVar53 = vfmadd231ps_fma(auVar159,auVar46,auVar122);
        auVar53 = vfmadd231ps_fma(auVar53,auVar38,auVar139);
        auVar53 = vfmadd231ps_fma(auVar53,auVar11,auVar144);
        auVar123._8_8_ = auVar53._0_8_;
        auVar123._0_8_ = auVar53._0_8_;
        auVar53 = vshufpd_avx(auVar53,auVar53,3);
        auVar80 = vshufps_avx(auVar82,auVar82,0x55);
        auVar53 = vsubps_avx(auVar53,auVar123);
        auVar80 = vfmadd213ps_fma(auVar53,auVar80,auVar123);
        fVar204 = auVar80._0_4_;
        auVar53 = vshufps_avx(auVar80,auVar80,0x55);
        auVar124._0_4_ = auVar83._0_4_ * fVar204 + auVar85._0_4_ * auVar53._0_4_;
        auVar124._4_4_ = auVar83._4_4_ * fVar204 + auVar85._4_4_ * auVar53._4_4_;
        auVar124._8_4_ = auVar83._8_4_ * fVar204 + auVar85._8_4_ * auVar53._8_4_;
        auVar124._12_4_ = auVar83._12_4_ * fVar204 + auVar85._12_4_ * auVar53._12_4_;
        auVar82 = vsubps_avx(auVar82,auVar124);
        auVar53 = vandps_avx512vl(auVar80,auVar241._0_16_);
        auVar80 = vprolq_avx512vl(auVar53,0x20);
        auVar53 = vmaxss_avx(auVar80,auVar53);
        bVar34 = auVar53._0_4_ <= fVar125;
      } while (fVar125 <= auVar53._0_4_);
      auVar53 = vucomiss_avx512f(auVar77);
      if (bVar34) {
        auVar83 = vucomiss_avx512f(auVar53);
        auVar244 = ZEXT1664(auVar83);
        if (bVar34) {
          vmovshdup_avx(auVar53);
          auVar83 = vucomiss_avx512f(auVar77);
          if (bVar34) {
            auVar80 = vucomiss_avx512f(auVar83);
            auVar244 = ZEXT1664(auVar80);
            if (bVar34) {
              auVar71 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                      ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c);
              auVar79 = vinsertps_avx(auVar71,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128[2]),
                                      0x28);
              auVar71 = vdpps_avx(auVar79,auVar39,0x7f);
              auVar72 = vdpps_avx(auVar79,auVar59,0x7f);
              auVar73 = vdpps_avx(auVar79,auVar60,0x7f);
              auVar75 = vdpps_avx(auVar79,auVar61,0x7f);
              auVar87 = vdpps_avx(auVar79,auVar51,0x7f);
              auVar84 = vdpps_avx(auVar79,auVar62,0x7f);
              auVar78 = vdpps_avx(auVar79,auVar63,0x7f);
              auVar79 = vdpps_avx(auVar79,auVar42,0x7f);
              auVar82 = vsubss_avx512f(auVar80,auVar83);
              fVar203 = auVar83._0_4_;
              auVar83 = vfmadd231ss_fma(ZEXT416((uint)(fVar203 * auVar87._0_4_)),auVar82,auVar71);
              auVar71 = vfmadd231ss_fma(ZEXT416((uint)(auVar84._0_4_ * fVar203)),auVar82,auVar72);
              auVar72 = vfmadd231ss_fma(ZEXT416((uint)(auVar78._0_4_ * fVar203)),auVar82,auVar73);
              auVar73 = vfmadd231ss_fma(ZEXT416((uint)(fVar203 * auVar79._0_4_)),auVar82,auVar75);
              auVar80 = vsubss_avx512f(auVar80,auVar53);
              auVar185._0_4_ = auVar80._0_4_;
              fVar204 = auVar185._0_4_ * auVar185._0_4_ * auVar185._0_4_;
              local_f8 = auVar53._0_4_;
              fVar193 = local_f8 * 3.0 * auVar185._0_4_ * auVar185._0_4_;
              fVar202 = auVar185._0_4_ * local_f8 * local_f8 * 3.0;
              fVar215 = local_f8 * local_f8 * local_f8;
              auVar80 = vfmadd231ss_fma(ZEXT416((uint)(fVar215 * auVar73._0_4_)),
                                        ZEXT416((uint)fVar202),auVar72);
              auVar80 = vfmadd231ss_fma(auVar80,ZEXT416((uint)fVar193),auVar71);
              auVar83 = vfmadd231ss_fma(auVar80,ZEXT416((uint)fVar204),auVar83);
              fVar214 = auVar83._0_4_;
              if ((fVar120 <= fVar214) &&
                 (fVar216 = *(float *)(ray + k * 4 + 0x80), fVar214 <= fVar216)) {
                local_e8 = vshufps_avx(auVar53,auVar53,0x55);
                auVar74 = vsubps_avx512vl(auVar74,local_e8);
                fVar217 = local_e8._0_4_;
                auVar189._0_4_ = fVar217 * auVar232._0_4_;
                fVar225 = local_e8._4_4_;
                auVar189._4_4_ = fVar225 * auVar232._4_4_;
                fVar226 = local_e8._8_4_;
                auVar189._8_4_ = fVar226 * auVar232._8_4_;
                fVar227 = local_e8._12_4_;
                auVar189._12_4_ = fVar227 * auVar232._12_4_;
                local_288 = auVar57._0_4_;
                fStack_284 = auVar57._4_4_;
                fStack_280 = auVar57._8_4_;
                fStack_27c = auVar57._12_4_;
                auVar201._0_4_ = fVar217 * local_288;
                auVar201._4_4_ = fVar225 * fStack_284;
                auVar201._8_4_ = fVar226 * fStack_280;
                auVar201._12_4_ = fVar227 * fStack_27c;
                local_298 = auVar58._0_4_;
                fStack_294 = auVar58._4_4_;
                fStack_290 = auVar58._8_4_;
                fStack_28c = auVar58._12_4_;
                auVar213._0_4_ = fVar217 * local_298;
                auVar213._4_4_ = fVar225 * fStack_294;
                auVar213._8_4_ = fVar226 * fStack_290;
                auVar213._12_4_ = fVar227 * fStack_28c;
                auVar223._0_4_ = fVar217 * auVar219._0_4_;
                auVar223._4_4_ = fVar225 * auVar219._4_4_;
                auVar223._8_4_ = fVar226 * auVar219._8_4_;
                auVar223._12_4_ = fVar227 * auVar219._12_4_;
                auVar53 = vfmadd231ps_fma(auVar189,auVar74,auVar52);
                auVar83 = vfmadd231ps_fma(auVar201,auVar74,auVar55);
                auVar80 = vfmadd231ps_fma(auVar213,auVar74,auVar56);
                auVar74 = vfmadd231ps_fma(auVar223,auVar74,auVar54);
                auVar53 = vsubps_avx(auVar83,auVar53);
                auVar83 = vsubps_avx(auVar80,auVar83);
                auVar80 = vsubps_avx(auVar74,auVar80);
                auVar224._0_4_ = local_f8 * auVar83._0_4_;
                auVar224._4_4_ = local_f8 * auVar83._4_4_;
                auVar224._8_4_ = local_f8 * auVar83._8_4_;
                auVar224._12_4_ = local_f8 * auVar83._12_4_;
                auVar185._4_4_ = auVar185._0_4_;
                auVar185._8_4_ = auVar185._0_4_;
                auVar185._12_4_ = auVar185._0_4_;
                auVar53 = vfmadd231ps_fma(auVar224,auVar185,auVar53);
                auVar190._0_4_ = local_f8 * auVar80._0_4_;
                auVar190._4_4_ = local_f8 * auVar80._4_4_;
                auVar190._8_4_ = local_f8 * auVar80._8_4_;
                auVar190._12_4_ = local_f8 * auVar80._12_4_;
                auVar83 = vfmadd231ps_fma(auVar190,auVar185,auVar83);
                auVar191._0_4_ = local_f8 * auVar83._0_4_;
                auVar191._4_4_ = local_f8 * auVar83._4_4_;
                auVar191._8_4_ = local_f8 * auVar83._8_4_;
                auVar191._12_4_ = local_f8 * auVar83._12_4_;
                auVar53 = vfmadd231ps_fma(auVar191,auVar185,auVar53);
                auVar16._8_4_ = 0x40400000;
                auVar16._0_8_ = 0x4040000040400000;
                auVar16._12_4_ = 0x40400000;
                auVar53 = vmulps_avx512vl(auVar53,auVar16);
                pGVar7 = (context->scene->geometries).items[uVar4].ptr;
                if ((pGVar7->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                  local_2d8 = auVar68._0_4_;
                  fStack_2d4 = auVar68._4_4_;
                  fStack_2d0 = auVar68._8_4_;
                  fStack_2cc = auVar68._12_4_;
                  auVar164._0_4_ = fVar215 * local_2d8;
                  auVar164._4_4_ = fVar215 * fStack_2d4;
                  auVar164._8_4_ = fVar215 * fStack_2d0;
                  auVar164._12_4_ = fVar215 * fStack_2cc;
                  auVar160._4_4_ = fVar202;
                  auVar160._0_4_ = fVar202;
                  auVar160._8_4_ = fVar202;
                  auVar160._12_4_ = fVar202;
                  auVar83 = vfmadd132ps_fma(auVar160,auVar164,auVar67);
                  auVar153._4_4_ = fVar193;
                  auVar153._0_4_ = fVar193;
                  auVar153._8_4_ = fVar193;
                  auVar153._12_4_ = fVar193;
                  auVar83 = vfmadd132ps_fma(auVar153,auVar83,auVar66);
                  auVar140._4_4_ = fVar204;
                  auVar140._0_4_ = fVar204;
                  auVar140._8_4_ = fVar204;
                  auVar140._12_4_ = fVar204;
                  auVar74 = vfmadd132ps_fma(auVar140,auVar83,auVar37);
                  auVar83 = vshufps_avx(auVar74,auVar74,0xc9);
                  auVar80 = vshufps_avx(auVar53,auVar53,0xc9);
                  auVar141._0_4_ = auVar74._0_4_ * auVar80._0_4_;
                  auVar141._4_4_ = auVar74._4_4_ * auVar80._4_4_;
                  auVar141._8_4_ = auVar74._8_4_ * auVar80._8_4_;
                  auVar141._12_4_ = auVar74._12_4_ * auVar80._12_4_;
                  auVar53 = vfmsub231ps_fma(auVar141,auVar53,auVar83);
                  local_108 = auVar53._0_4_;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar7->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    *(float *)(ray + k * 4 + 0x80) = fVar214;
                    uVar126 = vextractps_avx(auVar53,1);
                    *(undefined4 *)(ray + k * 4 + 0xc0) = uVar126;
                    uVar126 = vextractps_avx(auVar53,2);
                    *(undefined4 *)(ray + k * 4 + 0xd0) = uVar126;
                    *(undefined4 *)(ray + k * 4 + 0xe0) = local_108;
                    *(float *)(ray + k * 4 + 0xf0) = local_f8;
                    *(float *)(ray + k * 4 + 0x100) = fVar203;
                    *(uint *)(ray + k * 4 + 0x110) = uVar5;
                    *(uint *)(ray + k * 4 + 0x120) = uVar4;
                    *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                    goto LAB_01811d81;
                  }
                  auVar83 = vshufps_avx(auVar53,auVar53,0x55);
                  local_118 = vshufps_avx(auVar53,auVar53,0xaa);
                  local_128[0] = (RTCHitN)auVar83[0];
                  local_128[1] = (RTCHitN)auVar83[1];
                  local_128[2] = (RTCHitN)auVar83[2];
                  local_128[3] = (RTCHitN)auVar83[3];
                  local_128[4] = (RTCHitN)auVar83[4];
                  local_128[5] = (RTCHitN)auVar83[5];
                  local_128[6] = (RTCHitN)auVar83[6];
                  local_128[7] = (RTCHitN)auVar83[7];
                  local_128[8] = (RTCHitN)auVar83[8];
                  local_128[9] = (RTCHitN)auVar83[9];
                  local_128[10] = (RTCHitN)auVar83[10];
                  local_128[0xb] = (RTCHitN)auVar83[0xb];
                  local_128[0xc] = (RTCHitN)auVar83[0xc];
                  local_128[0xd] = (RTCHitN)auVar83[0xd];
                  local_128[0xe] = (RTCHitN)auVar83[0xe];
                  local_128[0xf] = (RTCHitN)auVar83[0xf];
                  uStack_104 = local_108;
                  uStack_100 = local_108;
                  uStack_fc = local_108;
                  fStack_f4 = local_f8;
                  fStack_f0 = local_f8;
                  fStack_ec = local_f8;
                  local_308 = auVar70._0_8_;
                  uStack_300 = auVar70._8_8_;
                  local_d8 = local_308;
                  uStack_d0 = uStack_300;
                  local_c8 = auVar69;
                  vpcmpeqd_avx2(ZEXT1632(auVar69),ZEXT1632(auVar69));
                  uStack_b4 = context->user->instID[0];
                  local_b8 = uStack_b4;
                  uStack_b0 = uStack_b4;
                  uStack_ac = uStack_b4;
                  uStack_a8 = context->user->instPrimID[0];
                  uStack_a4 = uStack_a8;
                  uStack_a0 = uStack_a8;
                  uStack_9c = uStack_a8;
                  *(float *)(ray + k * 4 + 0x80) = fVar214;
                  args.valid = (int *)local_368;
                  args.geometryUserPtr = pGVar7->userPtr;
                  args.context = context->user;
                  args.hit = local_128;
                  args.N = 4;
                  local_368 = auVar40;
                  args.ray = (RTCRayN *)ray;
                  if (pGVar7->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar7->intersectionFilterN)(&args);
                    auVar53 = vxorps_avx512vl(auVar77,auVar77);
                    auVar243 = ZEXT1664(auVar53);
                    auVar244 = ZEXT464(0x3f800000);
                    auVar240 = ZEXT3264(_DAT_01fb9fe0);
                    auVar53 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                    auVar239 = ZEXT1664(auVar53);
                    auVar105 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                    auVar238 = ZEXT3264(auVar105);
                    auVar53 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
                    auVar237 = ZEXT1664(auVar53);
                    auVar53 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                    auVar245 = ZEXT1664(auVar53);
                    auVar53 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                    auVar242 = ZEXT1664(auVar53);
                    auVar53 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                    auVar241 = ZEXT1664(auVar53);
                  }
                  auVar53 = auVar243._0_16_;
                  uVar31 = vptestmd_avx512vl(local_368,local_368);
                  if ((uVar31 & 0xf) != 0) {
                    p_Var8 = context->args->filter;
                    if ((p_Var8 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var8)(&args);
                      auVar53 = vxorps_avx512vl(auVar53,auVar53);
                      auVar243 = ZEXT1664(auVar53);
                      auVar244 = ZEXT464(0x3f800000);
                      auVar240 = ZEXT3264(_DAT_01fb9fe0);
                      auVar53 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                      auVar239 = ZEXT1664(auVar53);
                      auVar105 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                      auVar238 = ZEXT3264(auVar105);
                      auVar53 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
                      auVar237 = ZEXT1664(auVar53);
                      auVar53 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                      auVar245 = ZEXT1664(auVar53);
                      auVar53 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                      auVar242 = ZEXT1664(auVar53);
                      auVar53 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                      auVar241 = ZEXT1664(auVar53);
                    }
                    uVar31 = vptestmd_avx512vl(local_368,local_368);
                    uVar31 = uVar31 & 0xf;
                    bVar24 = (byte)uVar31;
                    if (bVar24 != 0) {
                      iVar21 = *(int *)(args.hit + 4);
                      iVar22 = *(int *)(args.hit + 8);
                      iVar23 = *(int *)(args.hit + 0xc);
                      bVar34 = (bool)((byte)(uVar31 >> 1) & 1);
                      bVar33 = (bool)((byte)(uVar31 >> 2) & 1);
                      bVar32 = SUB81(uVar31 >> 3,0);
                      *(uint *)(args.ray + 0xc0) =
                           (uint)(bVar24 & 1) * *(int *)args.hit |
                           (uint)!(bool)(bVar24 & 1) * *(uint *)(args.ray + 0xc0);
                      *(uint *)(args.ray + 0xc4) =
                           (uint)bVar34 * iVar21 | (uint)!bVar34 * *(int *)(args.ray + 0xc4);
                      *(uint *)(args.ray + 200) =
                           (uint)bVar33 * iVar22 | (uint)!bVar33 * *(int *)(args.ray + 200);
                      *(uint *)(args.ray + 0xcc) =
                           (uint)bVar32 * iVar23 | (uint)!bVar32 * *(int *)(args.ray + 0xcc);
                      iVar21 = *(int *)(args.hit + 0x14);
                      iVar22 = *(int *)(args.hit + 0x18);
                      iVar23 = *(int *)(args.hit + 0x1c);
                      bVar34 = (bool)((byte)(uVar31 >> 1) & 1);
                      bVar33 = (bool)((byte)(uVar31 >> 2) & 1);
                      bVar32 = SUB81(uVar31 >> 3,0);
                      *(uint *)(args.ray + 0xd0) =
                           (uint)(bVar24 & 1) * *(int *)(args.hit + 0x10) |
                           (uint)!(bool)(bVar24 & 1) * *(uint *)(args.ray + 0xd0);
                      *(uint *)(args.ray + 0xd4) =
                           (uint)bVar34 * iVar21 | (uint)!bVar34 * *(int *)(args.ray + 0xd4);
                      *(uint *)(args.ray + 0xd8) =
                           (uint)bVar33 * iVar22 | (uint)!bVar33 * *(int *)(args.ray + 0xd8);
                      *(uint *)(args.ray + 0xdc) =
                           (uint)bVar32 * iVar23 | (uint)!bVar32 * *(int *)(args.ray + 0xdc);
                      iVar21 = *(int *)(args.hit + 0x24);
                      iVar22 = *(int *)(args.hit + 0x28);
                      iVar23 = *(int *)(args.hit + 0x2c);
                      bVar34 = (bool)((byte)(uVar31 >> 1) & 1);
                      bVar33 = (bool)((byte)(uVar31 >> 2) & 1);
                      bVar32 = SUB81(uVar31 >> 3,0);
                      *(uint *)(args.ray + 0xe0) =
                           (uint)(bVar24 & 1) * *(int *)(args.hit + 0x20) |
                           (uint)!(bool)(bVar24 & 1) * *(uint *)(args.ray + 0xe0);
                      *(uint *)(args.ray + 0xe4) =
                           (uint)bVar34 * iVar21 | (uint)!bVar34 * *(int *)(args.ray + 0xe4);
                      *(uint *)(args.ray + 0xe8) =
                           (uint)bVar33 * iVar22 | (uint)!bVar33 * *(int *)(args.ray + 0xe8);
                      *(uint *)(args.ray + 0xec) =
                           (uint)bVar32 * iVar23 | (uint)!bVar32 * *(int *)(args.ray + 0xec);
                      iVar21 = *(int *)(args.hit + 0x34);
                      iVar22 = *(int *)(args.hit + 0x38);
                      iVar23 = *(int *)(args.hit + 0x3c);
                      bVar34 = (bool)((byte)(uVar31 >> 1) & 1);
                      bVar33 = (bool)((byte)(uVar31 >> 2) & 1);
                      bVar32 = SUB81(uVar31 >> 3,0);
                      *(uint *)(args.ray + 0xf0) =
                           (uint)(bVar24 & 1) * *(int *)(args.hit + 0x30) |
                           (uint)!(bool)(bVar24 & 1) * *(uint *)(args.ray + 0xf0);
                      *(uint *)(args.ray + 0xf4) =
                           (uint)bVar34 * iVar21 | (uint)!bVar34 * *(int *)(args.ray + 0xf4);
                      *(uint *)(args.ray + 0xf8) =
                           (uint)bVar33 * iVar22 | (uint)!bVar33 * *(int *)(args.ray + 0xf8);
                      *(uint *)(args.ray + 0xfc) =
                           (uint)bVar32 * iVar23 | (uint)!bVar32 * *(int *)(args.ray + 0xfc);
                      iVar21 = *(int *)(args.hit + 0x44);
                      iVar22 = *(int *)(args.hit + 0x48);
                      iVar23 = *(int *)(args.hit + 0x4c);
                      bVar34 = (bool)((byte)(uVar31 >> 1) & 1);
                      bVar33 = (bool)((byte)(uVar31 >> 2) & 1);
                      bVar32 = SUB81(uVar31 >> 3,0);
                      *(uint *)(args.ray + 0x100) =
                           (uint)(bVar24 & 1) * *(int *)(args.hit + 0x40) |
                           (uint)!(bool)(bVar24 & 1) * *(uint *)(args.ray + 0x100);
                      *(uint *)(args.ray + 0x104) =
                           (uint)bVar34 * iVar21 | (uint)!bVar34 * *(int *)(args.ray + 0x104);
                      *(uint *)(args.ray + 0x108) =
                           (uint)bVar33 * iVar22 | (uint)!bVar33 * *(int *)(args.ray + 0x108);
                      *(uint *)(args.ray + 0x10c) =
                           (uint)bVar32 * iVar23 | (uint)!bVar32 * *(int *)(args.ray + 0x10c);
                      auVar53 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(args.hit + 0x50));
                      *(undefined1 (*) [16])(args.ray + 0x110) = auVar53;
                      auVar53 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(args.hit + 0x60));
                      *(undefined1 (*) [16])(args.ray + 0x120) = auVar53;
                      auVar53 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(args.hit + 0x70));
                      *(undefined1 (*) [16])(args.ray + 0x130) = auVar53;
                      auVar53 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(args.hit + 0x80));
                      *(undefined1 (*) [16])(args.ray + 0x140) = auVar53;
                      goto LAB_01811d81;
                    }
                  }
                  *(float *)(ray + k * 4 + 0x80) = fVar216;
                }
              }
            }
          }
        }
      }
      goto LAB_01811d81;
    }
    auVar83 = vinsertps_avx(auVar154,auVar155,0x10);
  } while( true );
}

Assistant:

static __forceinline void intersect_n(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);

          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }